

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx512::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  int iVar20;
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  bool bVar65;
  byte bVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  long lVar70;
  Geometry *geometry;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  long lVar71;
  byte bVar72;
  ulong uVar73;
  float fVar74;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar124;
  float fVar126;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar80 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar81 [16];
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar130;
  float fVar131;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar132;
  undefined4 uVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar139;
  float fVar140;
  undefined1 auVar138 [32];
  undefined8 uVar141;
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  float fVar145;
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5e0 [16];
  ulong local_5c8;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  Geometry *local_5a0;
  ulong local_598;
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  long local_450;
  ulong local_448;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined1 local_2d0 [16];
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar67 = (ulong)(byte)prim[1];
  fVar146 = *(float *)(prim + uVar67 * 0x19 + 0x12);
  auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar80 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar143 = vsubps_avx(auVar77,*(undefined1 (*) [16])(prim + uVar67 * 0x19 + 6));
  fVar145 = fVar146 * auVar143._0_4_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar67 * 4 + 6);
  auVar90 = vpmovsxbd_avx2(auVar77);
  fVar132 = fVar146 * auVar80._0_4_;
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar67 * 5 + 6);
  auVar87 = vpmovsxbd_avx2(auVar79);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar67 * 6 + 6);
  auVar88 = vpmovsxbd_avx2(auVar76);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar67 * 0xb + 6);
  auVar89 = vpmovsxbd_avx2(auVar75);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar67 * 0xc + 6);
  auVar92 = vpmovsxbd_avx2(auVar7);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar67 * 0xd + 6);
  auVar91 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar67 * 0x12 + 6);
  auVar100 = vpmovsxbd_avx2(auVar9);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar67 * 0x13 + 6);
  auVar99 = vpmovsxbd_avx2(auVar10);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar67 * 0x14 + 6);
  auVar94 = vpmovsxbd_avx2(auVar78);
  auVar93 = vcvtdq2ps_avx(auVar94);
  auVar173._8_4_ = 1;
  auVar173._0_8_ = 0x100000001;
  auVar173._12_4_ = 1;
  auVar173._16_4_ = 1;
  auVar173._20_4_ = 1;
  auVar173._24_4_ = 1;
  auVar173._28_4_ = 1;
  auVar170._4_4_ = fVar132;
  auVar170._0_4_ = fVar132;
  auVar170._8_4_ = fVar132;
  auVar170._12_4_ = fVar132;
  auVar170._16_4_ = fVar132;
  auVar170._20_4_ = fVar132;
  auVar170._24_4_ = fVar132;
  auVar170._28_4_ = fVar132;
  auVar86 = ZEXT1632(CONCAT412(fVar146 * auVar80._12_4_,
                               CONCAT48(fVar146 * auVar80._8_4_,
                                        CONCAT44(fVar146 * auVar80._4_4_,fVar132))));
  auVar95 = vpermps_avx2(auVar173,auVar86);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar85 = vpermps_avx512vl(auVar84,auVar86);
  fVar132 = auVar85._0_4_;
  auVar183._0_4_ = fVar132 * auVar88._0_4_;
  fVar139 = auVar85._4_4_;
  auVar183._4_4_ = fVar139 * auVar88._4_4_;
  fVar140 = auVar85._8_4_;
  auVar183._8_4_ = fVar140 * auVar88._8_4_;
  fVar160 = auVar85._12_4_;
  auVar183._12_4_ = fVar160 * auVar88._12_4_;
  fVar159 = auVar85._16_4_;
  auVar183._16_4_ = fVar159 * auVar88._16_4_;
  fVar161 = auVar85._20_4_;
  auVar183._20_4_ = fVar161 * auVar88._20_4_;
  fVar74 = auVar85._24_4_;
  auVar183._28_36_ = in_ZMM4._28_36_;
  auVar183._24_4_ = fVar74 * auVar88._24_4_;
  auVar86._4_4_ = auVar91._4_4_ * fVar139;
  auVar86._0_4_ = auVar91._0_4_ * fVar132;
  auVar86._8_4_ = auVar91._8_4_ * fVar140;
  auVar86._12_4_ = auVar91._12_4_ * fVar160;
  auVar86._16_4_ = auVar91._16_4_ * fVar159;
  auVar86._20_4_ = auVar91._20_4_ * fVar161;
  auVar86._24_4_ = auVar91._24_4_ * fVar74;
  auVar86._28_4_ = auVar94._28_4_;
  auVar94._4_4_ = fVar139 * auVar93._4_4_;
  auVar94._0_4_ = fVar132 * auVar93._0_4_;
  auVar94._8_4_ = fVar140 * auVar93._8_4_;
  auVar94._12_4_ = fVar160 * auVar93._12_4_;
  auVar94._16_4_ = fVar159 * auVar93._16_4_;
  auVar94._20_4_ = fVar161 * auVar93._20_4_;
  auVar94._24_4_ = fVar74 * auVar93._24_4_;
  auVar94._28_4_ = auVar85._28_4_;
  auVar77 = vfmadd231ps_fma(auVar183._0_32_,auVar95,auVar87);
  auVar79 = vfmadd231ps_fma(auVar86,auVar95,auVar92);
  auVar76 = vfmadd231ps_fma(auVar94,auVar99,auVar95);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar170,auVar90);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar170,auVar89);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar100,auVar170);
  auVar171._4_4_ = fVar145;
  auVar171._0_4_ = fVar145;
  auVar171._8_4_ = fVar145;
  auVar171._12_4_ = fVar145;
  auVar171._16_4_ = fVar145;
  auVar171._20_4_ = fVar145;
  auVar171._24_4_ = fVar145;
  auVar171._28_4_ = fVar145;
  auVar95 = ZEXT1632(CONCAT412(fVar146 * auVar143._12_4_,
                               CONCAT48(fVar146 * auVar143._8_4_,
                                        CONCAT44(fVar146 * auVar143._4_4_,fVar145))));
  auVar94 = vpermps_avx2(auVar173,auVar95);
  auVar86 = vpermps_avx512vl(auVar84,auVar95);
  fVar146 = auVar86._0_4_;
  fVar132 = auVar86._4_4_;
  auVar95._4_4_ = fVar132 * auVar88._4_4_;
  auVar95._0_4_ = fVar146 * auVar88._0_4_;
  fVar139 = auVar86._8_4_;
  auVar95._8_4_ = fVar139 * auVar88._8_4_;
  fVar140 = auVar86._12_4_;
  auVar95._12_4_ = fVar140 * auVar88._12_4_;
  fVar160 = auVar86._16_4_;
  auVar95._16_4_ = fVar160 * auVar88._16_4_;
  fVar159 = auVar86._20_4_;
  auVar95._20_4_ = fVar159 * auVar88._20_4_;
  fVar161 = auVar86._24_4_;
  auVar95._24_4_ = fVar161 * auVar88._24_4_;
  auVar95._28_4_ = auVar88._28_4_;
  auVar98._0_4_ = fVar146 * auVar91._0_4_;
  auVar98._4_4_ = fVar132 * auVar91._4_4_;
  auVar98._8_4_ = fVar139 * auVar91._8_4_;
  auVar98._12_4_ = fVar140 * auVar91._12_4_;
  auVar98._16_4_ = fVar160 * auVar91._16_4_;
  auVar98._20_4_ = fVar159 * auVar91._20_4_;
  auVar98._24_4_ = fVar161 * auVar91._24_4_;
  auVar98._28_4_ = 0;
  auVar91._4_4_ = fVar132 * auVar93._4_4_;
  auVar91._0_4_ = fVar146 * auVar93._0_4_;
  auVar91._8_4_ = fVar139 * auVar93._8_4_;
  auVar91._12_4_ = fVar140 * auVar93._12_4_;
  auVar91._16_4_ = fVar160 * auVar93._16_4_;
  auVar91._20_4_ = fVar159 * auVar93._20_4_;
  auVar91._24_4_ = fVar161 * auVar93._24_4_;
  auVar91._28_4_ = auVar93._28_4_;
  auVar75 = vfmadd231ps_fma(auVar95,auVar94,auVar87);
  auVar7 = vfmadd231ps_fma(auVar98,auVar94,auVar92);
  auVar8 = vfmadd231ps_fma(auVar91,auVar94,auVar99);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar171,auVar90);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar171,auVar89);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar171,auVar100);
  auVar164._8_4_ = 0x7fffffff;
  auVar164._0_8_ = 0x7fffffff7fffffff;
  auVar164._12_4_ = 0x7fffffff;
  auVar164._16_4_ = 0x7fffffff;
  auVar164._20_4_ = 0x7fffffff;
  auVar164._24_4_ = 0x7fffffff;
  auVar164._28_4_ = 0x7fffffff;
  auVar113._8_4_ = 0x219392ef;
  auVar113._0_8_ = 0x219392ef219392ef;
  auVar113._12_4_ = 0x219392ef;
  auVar113._16_4_ = 0x219392ef;
  auVar113._20_4_ = 0x219392ef;
  auVar113._24_4_ = 0x219392ef;
  auVar113._28_4_ = 0x219392ef;
  auVar90 = vandps_avx(auVar164,ZEXT1632(auVar77));
  uVar73 = vcmpps_avx512vl(auVar90,auVar113,1);
  bVar65 = (bool)((byte)uVar73 & 1);
  auVar84._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar77._0_4_;
  bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar77._4_4_;
  bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar77._8_4_;
  bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar77._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar73 >> 7) * 0x219392ef;
  auVar90 = vandps_avx(auVar164,ZEXT1632(auVar79));
  uVar73 = vcmpps_avx512vl(auVar90,auVar113,1);
  bVar65 = (bool)((byte)uVar73 & 1);
  auVar85._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar79._0_4_;
  bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar79._4_4_;
  bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar79._8_4_;
  bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar79._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar73 >> 7) * 0x219392ef;
  auVar90 = vandps_avx(auVar164,ZEXT1632(auVar76));
  uVar73 = vcmpps_avx512vl(auVar90,auVar113,1);
  bVar65 = (bool)((byte)uVar73 & 1);
  auVar90._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar76._0_4_;
  bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar76._4_4_;
  bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar76._8_4_;
  bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar76._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar73 >> 7) * 0x219392ef;
  auVar87 = vrcp14ps_avx512vl(auVar84);
  auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar89 = vfnmadd213ps_avx512vl(auVar84,auVar87,auVar88);
  auVar77 = vfmadd132ps_fma(auVar89,auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar85);
  auVar89 = vfnmadd213ps_avx512vl(auVar85,auVar87,auVar88);
  auVar79 = vfmadd132ps_fma(auVar89,auVar87,auVar87);
  auVar87 = vrcp14ps_avx512vl(auVar90);
  auVar90 = vfnmadd213ps_avx512vl(auVar90,auVar87,auVar88);
  auVar76 = vfmadd132ps_fma(auVar90,auVar87,auVar87);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 7 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar75));
  auVar100._4_4_ = auVar77._4_4_ * auVar90._4_4_;
  auVar100._0_4_ = auVar77._0_4_ * auVar90._0_4_;
  auVar100._8_4_ = auVar77._8_4_ * auVar90._8_4_;
  auVar100._12_4_ = auVar77._12_4_ * auVar90._12_4_;
  auVar100._16_4_ = auVar90._16_4_ * 0.0;
  auVar100._20_4_ = auVar90._20_4_ * 0.0;
  auVar100._24_4_ = auVar90._24_4_ * 0.0;
  auVar100._28_4_ = auVar90._28_4_;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 9 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar75));
  auVar112._0_4_ = auVar77._0_4_ * auVar90._0_4_;
  auVar112._4_4_ = auVar77._4_4_ * auVar90._4_4_;
  auVar112._8_4_ = auVar77._8_4_ * auVar90._8_4_;
  auVar112._12_4_ = auVar77._12_4_ * auVar90._12_4_;
  auVar112._16_4_ = auVar90._16_4_ * 0.0;
  auVar112._20_4_ = auVar90._20_4_ * 0.0;
  auVar112._24_4_ = auVar90._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 0xe + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar7));
  auVar99._4_4_ = auVar79._4_4_ * auVar90._4_4_;
  auVar99._0_4_ = auVar79._0_4_ * auVar90._0_4_;
  auVar99._8_4_ = auVar79._8_4_ * auVar90._8_4_;
  auVar99._12_4_ = auVar79._12_4_ * auVar90._12_4_;
  auVar99._16_4_ = auVar90._16_4_ * 0.0;
  auVar99._20_4_ = auVar90._20_4_ * 0.0;
  auVar99._24_4_ = auVar90._24_4_ * 0.0;
  auVar99._28_4_ = auVar90._28_4_;
  auVar91 = vpbroadcastd_avx512vl();
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar7));
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 0x15 + 6));
  auVar97._0_4_ = auVar79._0_4_ * auVar90._0_4_;
  auVar97._4_4_ = auVar79._4_4_ * auVar90._4_4_;
  auVar97._8_4_ = auVar79._8_4_ * auVar90._8_4_;
  auVar97._12_4_ = auVar79._12_4_ * auVar90._12_4_;
  auVar97._16_4_ = auVar90._16_4_ * 0.0;
  auVar97._20_4_ = auVar90._20_4_ * 0.0;
  auVar97._24_4_ = auVar90._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar90 = vcvtdq2ps_avx(auVar87);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar8));
  auVar93._4_4_ = auVar90._4_4_ * auVar76._4_4_;
  auVar93._0_4_ = auVar90._0_4_ * auVar76._0_4_;
  auVar93._8_4_ = auVar90._8_4_ * auVar76._8_4_;
  auVar93._12_4_ = auVar90._12_4_ * auVar76._12_4_;
  auVar93._16_4_ = auVar90._16_4_ * 0.0;
  auVar93._20_4_ = auVar90._20_4_ * 0.0;
  auVar93._24_4_ = auVar90._24_4_ * 0.0;
  auVar93._28_4_ = auVar90._28_4_;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 * 0x17 + 6));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar90 = vsubps_avx(auVar90,ZEXT1632(auVar8));
  auVar96._0_4_ = auVar76._0_4_ * auVar90._0_4_;
  auVar96._4_4_ = auVar76._4_4_ * auVar90._4_4_;
  auVar96._8_4_ = auVar76._8_4_ * auVar90._8_4_;
  auVar96._12_4_ = auVar76._12_4_ * auVar90._12_4_;
  auVar96._16_4_ = auVar90._16_4_ * 0.0;
  auVar96._20_4_ = auVar90._20_4_ * 0.0;
  auVar96._24_4_ = auVar90._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar90 = vpminsd_avx2(auVar100,auVar112);
  auVar87 = vpminsd_avx2(auVar99,auVar97);
  auVar90 = vmaxps_avx(auVar90,auVar87);
  auVar87 = vpminsd_avx2(auVar93,auVar96);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar88._4_4_ = uVar133;
  auVar88._0_4_ = uVar133;
  auVar88._8_4_ = uVar133;
  auVar88._12_4_ = uVar133;
  auVar88._16_4_ = uVar133;
  auVar88._20_4_ = uVar133;
  auVar88._24_4_ = uVar133;
  auVar88._28_4_ = uVar133;
  auVar87 = vmaxps_avx512vl(auVar87,auVar88);
  auVar90 = vmaxps_avx(auVar90,auVar87);
  auVar87._8_4_ = 0x3f7ffffa;
  auVar87._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar87._12_4_ = 0x3f7ffffa;
  auVar87._16_4_ = 0x3f7ffffa;
  auVar87._20_4_ = 0x3f7ffffa;
  auVar87._24_4_ = 0x3f7ffffa;
  auVar87._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar90,auVar87);
  auVar90 = vpmaxsd_avx2(auVar100,auVar112);
  auVar87 = vpmaxsd_avx2(auVar99,auVar97);
  auVar90 = vminps_avx(auVar90,auVar87);
  auVar87 = vpmaxsd_avx2(auVar93,auVar96);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar89._4_4_ = uVar133;
  auVar89._0_4_ = uVar133;
  auVar89._8_4_ = uVar133;
  auVar89._12_4_ = uVar133;
  auVar89._16_4_ = uVar133;
  auVar89._20_4_ = uVar133;
  auVar89._24_4_ = uVar133;
  auVar89._28_4_ = uVar133;
  auVar87 = vminps_avx512vl(auVar87,auVar89);
  auVar90 = vminps_avx(auVar90,auVar87);
  auVar92._8_4_ = 0x3f800003;
  auVar92._0_8_ = 0x3f8000033f800003;
  auVar92._12_4_ = 0x3f800003;
  auVar92._16_4_ = 0x3f800003;
  auVar92._20_4_ = 0x3f800003;
  auVar92._24_4_ = 0x3f800003;
  auVar92._28_4_ = 0x3f800003;
  auVar90 = vmulps_avx512vl(auVar90,auVar92);
  uVar141 = vcmpps_avx512vl(local_80,auVar90,2);
  uVar19 = vpcmpgtd_avx512vl(auVar91,_DAT_01fb4ba0);
  local_448 = (ulong)(byte)((byte)uVar141 & (byte)uVar19);
  local_390 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  while (local_448 != 0) {
    iVar20 = 0;
    for (uVar73 = local_448; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
      iVar20 = iVar20 + 1;
    }
    uVar69 = local_448 - 1 & local_448;
    uVar73 = (ulong)(uint)(iVar20 << 6);
    local_5c8 = (ulong)*(uint *)(prim + 2);
    pGVar11 = (context->scene->geometries).items[local_5c8].ptr;
    local_5c0 = *(undefined1 (*) [16])(prim + uVar73 + uVar67 * 0x19 + 0x16);
    if (uVar69 != 0) {
      uVar68 = uVar69 - 1 & uVar69;
      for (uVar21 = uVar69; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
      }
      if (uVar68 != 0) {
        for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
        }
      }
    }
    local_4f0 = *(undefined1 (*) [16])(prim + uVar73 + uVar67 * 0x19 + 0x26);
    local_500 = *(undefined1 (*) [16])(prim + uVar73 + uVar67 * 0x19 + 0x36);
    _local_370 = *(undefined1 (*) [16])(prim + uVar73 + uVar67 * 0x19 + 0x46);
    iVar20 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar76 = vsubps_avx(local_5c0,auVar77);
    uVar133 = auVar76._0_4_;
    auVar80._4_4_ = uVar133;
    auVar80._0_4_ = uVar133;
    auVar80._8_4_ = uVar133;
    auVar80._12_4_ = uVar133;
    auVar79 = vshufps_avx(auVar76,auVar76,0x55);
    auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
    aVar5 = pre->ray_space[k].vx.field_0;
    aVar6 = pre->ray_space[k].vy.field_0;
    fVar146 = pre->ray_space[k].vz.field_0.m128[0];
    fVar132 = pre->ray_space[k].vz.field_0.m128[1];
    fVar139 = pre->ray_space[k].vz.field_0.m128[2];
    fVar140 = pre->ray_space[k].vz.field_0.m128[3];
    auVar81._0_4_ = fVar146 * auVar76._0_4_;
    auVar81._4_4_ = fVar132 * auVar76._4_4_;
    auVar81._8_4_ = fVar139 * auVar76._8_4_;
    auVar81._12_4_ = fVar140 * auVar76._12_4_;
    auVar79 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar6,auVar79);
    auVar7 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar5,auVar80);
    auVar79 = vshufps_avx(local_5c0,local_5c0,0xff);
    auVar75 = vsubps_avx(local_4f0,auVar77);
    uVar133 = auVar75._0_4_;
    auVar147._4_4_ = uVar133;
    auVar147._0_4_ = uVar133;
    auVar147._8_4_ = uVar133;
    auVar147._12_4_ = uVar133;
    auVar76 = vshufps_avx(auVar75,auVar75,0x55);
    auVar75 = vshufps_avx(auVar75,auVar75,0xaa);
    auVar165._0_4_ = fVar146 * auVar75._0_4_;
    auVar165._4_4_ = fVar132 * auVar75._4_4_;
    auVar165._8_4_ = fVar139 * auVar75._8_4_;
    auVar165._12_4_ = fVar140 * auVar75._12_4_;
    auVar76 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar6,auVar76);
    auVar8 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar5,auVar147);
    auVar75 = vsubps_avx512vl(local_500,auVar77);
    uVar133 = auVar75._0_4_;
    auVar148._4_4_ = uVar133;
    auVar148._0_4_ = uVar133;
    auVar148._8_4_ = uVar133;
    auVar148._12_4_ = uVar133;
    auVar76 = vshufps_avx(auVar75,auVar75,0x55);
    auVar75 = vshufps_avx(auVar75,auVar75,0xaa);
    auVar167._0_4_ = fVar146 * auVar75._0_4_;
    auVar167._4_4_ = fVar132 * auVar75._4_4_;
    auVar167._8_4_ = fVar139 * auVar75._8_4_;
    auVar167._12_4_ = fVar140 * auVar75._12_4_;
    auVar76 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar6,auVar76);
    auVar75 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar5,auVar148);
    auVar76 = vsubps_avx512vl(_local_370,auVar77);
    uVar133 = auVar76._0_4_;
    auVar143._4_4_ = uVar133;
    auVar143._0_4_ = uVar133;
    auVar143._8_4_ = uVar133;
    auVar143._12_4_ = uVar133;
    auVar77 = vshufps_avx(auVar76,auVar76,0x55);
    auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
    auVar168._0_4_ = fVar146 * auVar76._0_4_;
    auVar168._4_4_ = fVar132 * auVar76._4_4_;
    auVar168._8_4_ = fVar139 * auVar76._8_4_;
    auVar168._12_4_ = fVar140 * auVar76._12_4_;
    auVar77 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar6,auVar77);
    auVar76 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar5,auVar143);
    local_450 = (long)iVar20;
    lVar70 = local_450 * 0x44;
    auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar70);
    local_3e0 = vbroadcastss_avx512vl(auVar7);
    auVar87 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x484);
    auVar138._8_4_ = 1;
    auVar138._0_8_ = 0x100000001;
    auVar138._12_4_ = 1;
    auVar138._16_4_ = 1;
    auVar138._20_4_ = 1;
    auVar138._24_4_ = 1;
    auVar138._28_4_ = 1;
    local_400 = vpermps_avx2(auVar138,ZEXT1632(auVar7));
    local_420 = vbroadcastss_avx512vl(auVar8);
    local_540 = vpermps_avx2(auVar138,ZEXT1632(auVar8));
    auVar88 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x908);
    local_560 = vbroadcastss_avx512vl(auVar75);
    local_4e0 = vpermps_avx512vl(auVar138,ZEXT1632(auVar75));
    auVar89 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0xd8c);
    local_4a0 = vbroadcastss_avx512vl(auVar76);
    auVar183 = ZEXT3264(local_4a0);
    local_4c0 = vpermps_avx512vl(auVar138,ZEXT1632(auVar76));
    auVar184 = ZEXT3264(local_4c0);
    auVar92 = vmulps_avx512vl(local_4a0,auVar89);
    auVar91 = vmulps_avx512vl(local_4c0,auVar89);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,local_560);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,local_4e0);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar87,local_420);
    auVar77 = vfmadd231ps_fma(auVar91,auVar87,local_540);
    auVar93 = vfmadd231ps_avx512vl(auVar92,auVar90,local_3e0);
    auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar70);
    auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x484);
    auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x908);
    auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar90,local_400);
    auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0xd8c);
    auVar95 = vmulps_avx512vl(local_4a0,auVar99);
    auVar86 = vmulps_avx512vl(local_4c0,auVar99);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,local_560);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar100,local_4e0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_420);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar91,local_540);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,local_3e0);
    auVar9 = vfmadd231ps_fma(auVar86,auVar92,local_400);
    auVar86 = vsubps_avx512vl(auVar95,auVar93);
    auVar84 = vsubps_avx512vl(ZEXT1632(auVar9),auVar94);
    auVar85 = vmulps_avx512vl(auVar94,auVar86);
    auVar96 = vmulps_avx512vl(auVar93,auVar84);
    auVar85 = vsubps_avx512vl(auVar85,auVar96);
    auVar77 = vshufps_avx(local_4f0,local_4f0,0xff);
    uVar141 = auVar79._0_8_;
    local_a0._8_8_ = uVar141;
    local_a0._0_8_ = uVar141;
    local_a0._16_8_ = uVar141;
    local_a0._24_8_ = uVar141;
    local_c0 = vbroadcastsd_avx512vl(auVar77);
    auVar77 = vshufps_avx512vl(local_500,local_500,0xff);
    local_e0 = vbroadcastsd_avx512vl(auVar77);
    auVar77 = vshufps_avx512vl(_local_370,_local_370,0xff);
    uVar141 = auVar77._0_8_;
    register0x000012c8 = uVar141;
    local_100 = uVar141;
    register0x000012d0 = uVar141;
    register0x000012d8 = uVar141;
    auVar96 = vmulps_avx512vl(_local_100,auVar89);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar88,local_e0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar87,local_c0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar90,local_a0);
    auVar97 = vmulps_avx512vl(_local_100,auVar99);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,local_e0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar91,local_c0);
    auVar10 = vfmadd231ps_fma(auVar97,auVar92,local_a0);
    auVar97 = vmulps_avx512vl(auVar84,auVar84);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar86,auVar86);
    auVar98 = vmaxps_avx512vl(auVar96,ZEXT1632(auVar10));
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar97 = vmulps_avx512vl(auVar98,auVar97);
    auVar85 = vmulps_avx512vl(auVar85,auVar85);
    uVar141 = vcmpps_avx512vl(auVar85,auVar97,2);
    auVar77 = vblendps_avx(auVar7,local_5c0,8);
    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar79 = vandps_avx512vl(auVar77,auVar78);
    auVar77 = vblendps_avx(auVar8,local_4f0,8);
    auVar77 = vandps_avx512vl(auVar77,auVar78);
    auVar79 = vmaxps_avx(auVar79,auVar77);
    auVar77 = vblendps_avx(auVar75,local_500,8);
    auVar80 = vandps_avx512vl(auVar77,auVar78);
    auVar77 = vblendps_avx(auVar76,_local_370,8);
    auVar77 = vandps_avx512vl(auVar77,auVar78);
    auVar77 = vmaxps_avx(auVar80,auVar77);
    auVar77 = vmaxps_avx(auVar79,auVar77);
    auVar79 = vmovshdup_avx(auVar77);
    auVar79 = vmaxss_avx(auVar79,auVar77);
    auVar77 = vshufpd_avx(auVar77,auVar77,1);
    local_510 = vcvtsi2ss_avx512f(_local_370,iVar20);
    auVar77 = vmaxss_avx(auVar77,auVar79);
    fVar146 = local_510._0_4_;
    auVar169._4_4_ = fVar146;
    auVar169._0_4_ = fVar146;
    auVar169._8_4_ = fVar146;
    auVar169._12_4_ = fVar146;
    auVar169._16_4_ = fVar146;
    auVar169._20_4_ = fVar146;
    auVar169._24_4_ = fVar146;
    auVar169._28_4_ = fVar146;
    uVar19 = vcmpps_avx512vl(auVar169,_DAT_01f7b060,0xe);
    bVar72 = (byte)uVar141 & (byte)uVar19;
    local_440 = auVar77._0_4_ * 4.7683716e-07;
    auVar144._8_4_ = 2;
    auVar144._0_8_ = 0x200000002;
    auVar144._12_4_ = 2;
    auVar144._16_4_ = 2;
    auVar144._20_4_ = 2;
    auVar144._24_4_ = 2;
    auVar144._28_4_ = 2;
    local_120 = vpermps_avx512vl(auVar144,ZEXT1632(auVar7));
    local_140 = vpermps_avx512vl(auVar144,ZEXT1632(auVar8));
    local_160 = vpermps_avx512vl(auVar144,ZEXT1632(auVar75));
    local_480 = vpermps_avx2(auVar144,ZEXT1632(auVar76));
    uVar133 = *(undefined4 *)(ray + k * 4 + 0x30);
    local_380 = vpbroadcastd_avx512vl();
    auVar77 = ZEXT416((uint)local_440);
    if (bVar72 == 0) {
      bVar65 = false;
      auVar77 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
      auVar178 = ZEXT1664(auVar77);
      auVar179 = ZEXT3264(local_3e0);
      auVar180 = ZEXT3264(local_400);
      auVar181 = ZEXT3264(local_420);
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar185 = ZEXT3264(auVar90);
      auVar177 = ZEXT3264(local_540);
      auVar176 = ZEXT3264(local_560);
      auVar182 = ZEXT3264(local_4e0);
    }
    else {
      auVar99 = vmulps_avx512vl(local_480,auVar99);
      auVar100 = vfmadd213ps_avx512vl(auVar100,local_160,auVar99);
      auVar91 = vfmadd213ps_avx512vl(auVar91,local_140,auVar100);
      auVar91 = vfmadd213ps_avx512vl(auVar92,local_120,auVar91);
      auVar89 = vmulps_avx512vl(local_480,auVar89);
      auVar88 = vfmadd213ps_avx512vl(auVar88,local_160,auVar89);
      auVar100 = vfmadd213ps_avx512vl(auVar87,local_140,auVar88);
      auVar87 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1210);
      auVar88 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1694);
      auVar89 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1b18);
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 + 0x1f9c);
      auVar100 = vfmadd213ps_avx512vl(auVar90,local_120,auVar100);
      auVar90 = vmulps_avx512vl(local_4a0,auVar92);
      auVar99 = vmulps_avx512vl(local_4c0,auVar92);
      auVar92 = vmulps_avx512vl(local_480,auVar92);
      auVar79 = vfmadd231ps_fma(auVar90,auVar89,local_560);
      auVar90 = vfmadd231ps_avx512vl(auVar99,auVar89,local_4e0);
      auVar89 = vfmadd231ps_avx512vl(auVar92,local_160,auVar89);
      auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar88,local_420);
      auVar177 = ZEXT3264(local_540);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar88,local_540);
      auVar99 = vfmadd231ps_avx512vl(auVar89,local_140,auVar88);
      auVar79 = vfmadd231ps_fma(auVar92,auVar87,local_3e0);
      auVar92 = vfmadd231ps_avx512vl(auVar90,auVar87,local_400);
      auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1210);
      auVar88 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1b18);
      auVar89 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1f9c);
      auVar99 = vfmadd231ps_avx512vl(auVar99,local_120,auVar87);
      auVar87 = vmulps_avx512vl(local_4a0,auVar89);
      auVar85 = vmulps_avx512vl(local_4c0,auVar89);
      auVar89 = vmulps_avx512vl(local_480,auVar89);
      auVar97 = vfmadd231ps_avx512vl(auVar87,auVar88,local_560);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar88,local_4e0);
      auVar88 = vfmadd231ps_avx512vl(auVar89,local_160,auVar88);
      auVar87 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 + 0x1694);
      auVar89 = vfmadd231ps_avx512vl(auVar97,auVar87,local_420);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar87,local_540);
      auVar87 = vfmadd231ps_avx512vl(auVar88,local_140,auVar87);
      auVar76 = vfmadd231ps_fma(auVar89,auVar90,local_3e0);
      auVar88 = vfmadd231ps_avx512vl(auVar85,auVar90,local_400);
      auVar89 = vfmadd231ps_avx512vl(auVar87,local_120,auVar90);
      auVar174._8_4_ = 0x7fffffff;
      auVar174._0_8_ = 0x7fffffff7fffffff;
      auVar174._12_4_ = 0x7fffffff;
      auVar174._16_4_ = 0x7fffffff;
      auVar174._20_4_ = 0x7fffffff;
      auVar174._24_4_ = 0x7fffffff;
      auVar174._28_4_ = 0x7fffffff;
      auVar90 = vandps_avx(ZEXT1632(auVar79),auVar174);
      auVar87 = vandps_avx(auVar92,auVar174);
      auVar87 = vmaxps_avx(auVar90,auVar87);
      auVar90 = vandps_avx(auVar99,auVar174);
      auVar90 = vmaxps_avx(auVar87,auVar90);
      auVar99 = vbroadcastss_avx512vl(auVar77);
      uVar73 = vcmpps_avx512vl(auVar90,auVar99,1);
      bVar65 = (bool)((byte)uVar73 & 1);
      auVar101._0_4_ = (float)((uint)bVar65 * auVar86._0_4_ | (uint)!bVar65 * auVar79._0_4_);
      bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar101._4_4_ = (float)((uint)bVar65 * auVar86._4_4_ | (uint)!bVar65 * auVar79._4_4_);
      bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar101._8_4_ = (float)((uint)bVar65 * auVar86._8_4_ | (uint)!bVar65 * auVar79._8_4_);
      bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar101._12_4_ = (float)((uint)bVar65 * auVar86._12_4_ | (uint)!bVar65 * auVar79._12_4_);
      fVar132 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar86._16_4_);
      auVar101._16_4_ = fVar132;
      fVar139 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar86._20_4_);
      auVar101._20_4_ = fVar139;
      fVar140 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar86._24_4_);
      auVar101._24_4_ = fVar140;
      uVar1 = (uint)(byte)(uVar73 >> 7) * auVar86._28_4_;
      auVar101._28_4_ = uVar1;
      bVar65 = (bool)((byte)uVar73 & 1);
      auVar102._0_4_ = (float)((uint)bVar65 * auVar84._0_4_ | (uint)!bVar65 * auVar92._0_4_);
      bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar102._4_4_ = (float)((uint)bVar65 * auVar84._4_4_ | (uint)!bVar65 * auVar92._4_4_);
      bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar102._8_4_ = (float)((uint)bVar65 * auVar84._8_4_ | (uint)!bVar65 * auVar92._8_4_);
      bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar102._12_4_ = (float)((uint)bVar65 * auVar84._12_4_ | (uint)!bVar65 * auVar92._12_4_);
      bVar65 = (bool)((byte)(uVar73 >> 4) & 1);
      auVar102._16_4_ = (float)((uint)bVar65 * auVar84._16_4_ | (uint)!bVar65 * auVar92._16_4_);
      bVar65 = (bool)((byte)(uVar73 >> 5) & 1);
      auVar102._20_4_ = (float)((uint)bVar65 * auVar84._20_4_ | (uint)!bVar65 * auVar92._20_4_);
      bVar65 = (bool)((byte)(uVar73 >> 6) & 1);
      auVar102._24_4_ = (float)((uint)bVar65 * auVar84._24_4_ | (uint)!bVar65 * auVar92._24_4_);
      bVar65 = SUB81(uVar73 >> 7,0);
      auVar102._28_4_ = (uint)bVar65 * auVar84._28_4_ | (uint)!bVar65 * auVar92._28_4_;
      auVar90 = vandps_avx(auVar174,ZEXT1632(auVar76));
      auVar87 = vandps_avx(auVar88,auVar174);
      auVar87 = vmaxps_avx(auVar90,auVar87);
      auVar90 = vandps_avx(auVar89,auVar174);
      auVar90 = vmaxps_avx(auVar87,auVar90);
      uVar73 = vcmpps_avx512vl(auVar90,auVar99,1);
      bVar65 = (bool)((byte)uVar73 & 1);
      auVar103._0_4_ = (float)((uint)bVar65 * auVar86._0_4_ | (uint)!bVar65 * auVar76._0_4_);
      bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar65 * auVar86._4_4_ | (uint)!bVar65 * auVar76._4_4_);
      bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar65 * auVar86._8_4_ | (uint)!bVar65 * auVar76._8_4_);
      bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar65 * auVar86._12_4_ | (uint)!bVar65 * auVar76._12_4_);
      fVar160 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar86._16_4_);
      auVar103._16_4_ = fVar160;
      fVar159 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar86._20_4_);
      auVar103._20_4_ = fVar159;
      fVar161 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar86._24_4_);
      auVar103._24_4_ = fVar161;
      auVar103._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar86._28_4_;
      bVar65 = (bool)((byte)uVar73 & 1);
      auVar104._0_4_ = (float)((uint)bVar65 * auVar84._0_4_ | (uint)!bVar65 * auVar88._0_4_);
      bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar65 * auVar84._4_4_ | (uint)!bVar65 * auVar88._4_4_);
      bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar65 * auVar84._8_4_ | (uint)!bVar65 * auVar88._8_4_);
      bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar65 * auVar84._12_4_ | (uint)!bVar65 * auVar88._12_4_);
      bVar65 = (bool)((byte)(uVar73 >> 4) & 1);
      auVar104._16_4_ = (float)((uint)bVar65 * auVar84._16_4_ | (uint)!bVar65 * auVar88._16_4_);
      bVar65 = (bool)((byte)(uVar73 >> 5) & 1);
      auVar104._20_4_ = (float)((uint)bVar65 * auVar84._20_4_ | (uint)!bVar65 * auVar88._20_4_);
      bVar65 = (bool)((byte)(uVar73 >> 6) & 1);
      auVar104._24_4_ = (float)((uint)bVar65 * auVar84._24_4_ | (uint)!bVar65 * auVar88._24_4_);
      bVar65 = SUB81(uVar73 >> 7,0);
      auVar104._28_4_ = (uint)bVar65 * auVar84._28_4_ | (uint)!bVar65 * auVar88._28_4_;
      auVar81 = vxorps_avx512vl(local_560._0_16_,local_560._0_16_);
      auVar178 = ZEXT1664(auVar81);
      auVar90 = vfmadd213ps_avx512vl(auVar101,auVar101,ZEXT1632(auVar81));
      auVar79 = vfmadd231ps_fma(auVar90,auVar102,auVar102);
      auVar90 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
      fVar74 = auVar90._0_4_;
      fVar145 = auVar90._4_4_;
      fVar124 = auVar90._8_4_;
      fVar125 = auVar90._12_4_;
      fVar126 = auVar90._16_4_;
      fVar127 = auVar90._20_4_;
      fVar128 = auVar90._24_4_;
      auVar29._4_4_ = fVar145 * fVar145 * fVar145 * auVar79._4_4_ * -0.5;
      auVar29._0_4_ = fVar74 * fVar74 * fVar74 * auVar79._0_4_ * -0.5;
      auVar29._8_4_ = fVar124 * fVar124 * fVar124 * auVar79._8_4_ * -0.5;
      auVar29._12_4_ = fVar125 * fVar125 * fVar125 * auVar79._12_4_ * -0.5;
      auVar29._16_4_ = fVar126 * fVar126 * fVar126 * -0.0;
      auVar29._20_4_ = fVar127 * fVar127 * fVar127 * -0.0;
      auVar29._24_4_ = fVar128 * fVar128 * fVar128 * -0.0;
      auVar29._28_4_ = 0;
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar88 = vfmadd231ps_avx512vl(auVar29,auVar87,auVar90);
      auVar30._4_4_ = auVar102._4_4_ * auVar88._4_4_;
      auVar30._0_4_ = auVar102._0_4_ * auVar88._0_4_;
      auVar30._8_4_ = auVar102._8_4_ * auVar88._8_4_;
      auVar30._12_4_ = auVar102._12_4_ * auVar88._12_4_;
      auVar30._16_4_ = auVar102._16_4_ * auVar88._16_4_;
      auVar30._20_4_ = auVar102._20_4_ * auVar88._20_4_;
      auVar30._24_4_ = auVar102._24_4_ * auVar88._24_4_;
      auVar30._28_4_ = auVar90._28_4_;
      auVar31._4_4_ = auVar88._4_4_ * -auVar101._4_4_;
      auVar31._0_4_ = auVar88._0_4_ * -auVar101._0_4_;
      auVar31._8_4_ = auVar88._8_4_ * -auVar101._8_4_;
      auVar31._12_4_ = auVar88._12_4_ * -auVar101._12_4_;
      auVar31._16_4_ = auVar88._16_4_ * -fVar132;
      auVar31._20_4_ = auVar88._20_4_ * -fVar139;
      auVar31._24_4_ = auVar88._24_4_ * -fVar140;
      auVar31._28_4_ = uVar1 ^ 0x80000000;
      auVar90 = vmulps_avx512vl(auVar88,ZEXT1632(auVar81));
      auVar86 = ZEXT1632(auVar81);
      auVar89 = vfmadd213ps_avx512vl(auVar103,auVar103,auVar86);
      auVar79 = vfmadd231ps_fma(auVar89,auVar104,auVar104);
      auVar89 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
      fVar132 = auVar89._0_4_;
      fVar139 = auVar89._4_4_;
      fVar140 = auVar89._8_4_;
      fVar74 = auVar89._12_4_;
      fVar145 = auVar89._16_4_;
      fVar124 = auVar89._20_4_;
      fVar125 = auVar89._24_4_;
      auVar32._4_4_ = fVar139 * fVar139 * fVar139 * auVar79._4_4_ * -0.5;
      auVar32._0_4_ = fVar132 * fVar132 * fVar132 * auVar79._0_4_ * -0.5;
      auVar32._8_4_ = fVar140 * fVar140 * fVar140 * auVar79._8_4_ * -0.5;
      auVar32._12_4_ = fVar74 * fVar74 * fVar74 * auVar79._12_4_ * -0.5;
      auVar32._16_4_ = fVar145 * fVar145 * fVar145 * -0.0;
      auVar32._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
      auVar32._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
      auVar32._28_4_ = 0;
      auVar87 = vfmadd231ps_avx512vl(auVar32,auVar87,auVar89);
      auVar33._4_4_ = auVar104._4_4_ * auVar87._4_4_;
      auVar33._0_4_ = auVar104._0_4_ * auVar87._0_4_;
      auVar33._8_4_ = auVar104._8_4_ * auVar87._8_4_;
      auVar33._12_4_ = auVar104._12_4_ * auVar87._12_4_;
      auVar33._16_4_ = auVar104._16_4_ * auVar87._16_4_;
      auVar33._20_4_ = auVar104._20_4_ * auVar87._20_4_;
      auVar33._24_4_ = auVar104._24_4_ * auVar87._24_4_;
      auVar33._28_4_ = auVar89._28_4_;
      auVar34._4_4_ = -auVar103._4_4_ * auVar87._4_4_;
      auVar34._0_4_ = -auVar103._0_4_ * auVar87._0_4_;
      auVar34._8_4_ = -auVar103._8_4_ * auVar87._8_4_;
      auVar34._12_4_ = -auVar103._12_4_ * auVar87._12_4_;
      auVar34._16_4_ = -fVar160 * auVar87._16_4_;
      auVar34._20_4_ = -fVar159 * auVar87._20_4_;
      auVar34._24_4_ = -fVar161 * auVar87._24_4_;
      auVar34._28_4_ = auVar88._28_4_;
      auVar87 = vmulps_avx512vl(auVar87,auVar86);
      auVar79 = vfmadd213ps_fma(auVar30,auVar96,auVar93);
      auVar76 = vfmadd213ps_fma(auVar31,auVar96,auVar94);
      auVar88 = vfmadd213ps_avx512vl(auVar90,auVar96,auVar100);
      auVar89 = vfmadd213ps_avx512vl(auVar33,ZEXT1632(auVar10),auVar95);
      auVar78 = vfnmadd213ps_fma(auVar30,auVar96,auVar93);
      auVar99 = ZEXT1632(auVar10);
      auVar75 = vfmadd213ps_fma(auVar34,auVar99,ZEXT1632(auVar9));
      auVar80 = vfnmadd213ps_fma(auVar31,auVar96,auVar94);
      auVar7 = vfmadd213ps_fma(auVar87,auVar99,auVar91);
      auVar92 = vfnmadd231ps_avx512vl(auVar100,auVar96,auVar90);
      auVar143 = vfnmadd213ps_fma(auVar33,auVar99,auVar95);
      auVar147 = vfnmadd213ps_fma(auVar34,auVar99,ZEXT1632(auVar9));
      auVar148 = vfnmadd231ps_fma(auVar91,ZEXT1632(auVar10),auVar87);
      auVar87 = vsubps_avx512vl(auVar89,ZEXT1632(auVar78));
      auVar90 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar80));
      auVar91 = vsubps_avx512vl(ZEXT1632(auVar7),auVar92);
      auVar100 = vmulps_avx512vl(auVar90,auVar92);
      auVar8 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar80),auVar91);
      auVar35._4_4_ = auVar78._4_4_ * auVar91._4_4_;
      auVar35._0_4_ = auVar78._0_4_ * auVar91._0_4_;
      auVar35._8_4_ = auVar78._8_4_ * auVar91._8_4_;
      auVar35._12_4_ = auVar78._12_4_ * auVar91._12_4_;
      auVar35._16_4_ = auVar91._16_4_ * 0.0;
      auVar35._20_4_ = auVar91._20_4_ * 0.0;
      auVar35._24_4_ = auVar91._24_4_ * 0.0;
      auVar35._28_4_ = auVar91._28_4_;
      auVar91 = vfmsub231ps_avx512vl(auVar35,auVar92,auVar87);
      auVar36._4_4_ = auVar80._4_4_ * auVar87._4_4_;
      auVar36._0_4_ = auVar80._0_4_ * auVar87._0_4_;
      auVar36._8_4_ = auVar80._8_4_ * auVar87._8_4_;
      auVar36._12_4_ = auVar80._12_4_ * auVar87._12_4_;
      auVar36._16_4_ = auVar87._16_4_ * 0.0;
      auVar36._20_4_ = auVar87._20_4_ * 0.0;
      auVar36._24_4_ = auVar87._24_4_ * 0.0;
      auVar36._28_4_ = auVar87._28_4_;
      auVar9 = vfmsub231ps_fma(auVar36,ZEXT1632(auVar78),auVar90);
      auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar86,auVar91);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar86,ZEXT1632(auVar8));
      auVar86 = ZEXT1632(auVar81);
      uVar73 = vcmpps_avx512vl(auVar90,auVar86,2);
      bVar66 = (byte)uVar73;
      fVar74 = (float)((uint)(bVar66 & 1) * auVar79._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar143._0_4_);
      bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
      fVar124 = (float)((uint)bVar65 * auVar79._4_4_ | (uint)!bVar65 * auVar143._4_4_);
      bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
      fVar126 = (float)((uint)bVar65 * auVar79._8_4_ | (uint)!bVar65 * auVar143._8_4_);
      bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
      fVar128 = (float)((uint)bVar65 * auVar79._12_4_ | (uint)!bVar65 * auVar143._12_4_);
      auVar100 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar126,CONCAT44(fVar124,fVar74))));
      fVar145 = (float)((uint)(bVar66 & 1) * auVar76._0_4_ |
                       (uint)!(bool)(bVar66 & 1) * auVar147._0_4_);
      bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
      fVar125 = (float)((uint)bVar65 * auVar76._4_4_ | (uint)!bVar65 * auVar147._4_4_);
      bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
      fVar127 = (float)((uint)bVar65 * auVar76._8_4_ | (uint)!bVar65 * auVar147._8_4_);
      bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
      fVar129 = (float)((uint)bVar65 * auVar76._12_4_ | (uint)!bVar65 * auVar147._12_4_);
      auVar99 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar127,CONCAT44(fVar125,fVar145))));
      auVar105._0_4_ =
           (float)((uint)(bVar66 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar148._0_4_);
      bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar65 * auVar88._4_4_ | (uint)!bVar65 * auVar148._4_4_);
      bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar65 * auVar88._8_4_ | (uint)!bVar65 * auVar148._8_4_);
      bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar65 * auVar88._12_4_ | (uint)!bVar65 * auVar148._12_4_);
      fVar140 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar88._16_4_);
      auVar105._16_4_ = fVar140;
      fVar139 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar88._20_4_);
      auVar105._20_4_ = fVar139;
      fVar132 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar88._24_4_);
      auVar105._24_4_ = fVar132;
      iVar2 = (uint)(byte)(uVar73 >> 7) * auVar88._28_4_;
      auVar105._28_4_ = iVar2;
      auVar87 = vblendmps_avx512vl(ZEXT1632(auVar78),auVar89);
      auVar106._0_4_ = (uint)(bVar66 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar8._0_4_
      ;
      bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar106._4_4_ = (uint)bVar65 * auVar87._4_4_ | (uint)!bVar65 * auVar8._4_4_;
      bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar106._8_4_ = (uint)bVar65 * auVar87._8_4_ | (uint)!bVar65 * auVar8._8_4_;
      bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar106._12_4_ = (uint)bVar65 * auVar87._12_4_ | (uint)!bVar65 * auVar8._12_4_;
      auVar106._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar87._16_4_;
      auVar106._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar87._20_4_;
      auVar106._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar87._24_4_;
      auVar106._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar87._28_4_;
      auVar87 = vblendmps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar75));
      auVar107._0_4_ =
           (float)((uint)(bVar66 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar76._0_4_);
      bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar65 * auVar87._4_4_ | (uint)!bVar65 * auVar76._4_4_);
      bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar65 * auVar87._8_4_ | (uint)!bVar65 * auVar76._8_4_);
      bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar65 * auVar87._12_4_ | (uint)!bVar65 * auVar76._12_4_);
      fVar161 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar87._16_4_);
      auVar107._16_4_ = fVar161;
      fVar160 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar87._20_4_);
      auVar107._20_4_ = fVar160;
      fVar159 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar87._24_4_);
      auVar107._24_4_ = fVar159;
      auVar107._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar87._28_4_;
      auVar87 = vblendmps_avx512vl(auVar92,ZEXT1632(auVar7));
      auVar108._0_4_ =
           (float)((uint)(bVar66 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar88._0_4_);
      bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar65 * auVar87._4_4_ | (uint)!bVar65 * auVar88._4_4_);
      bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar65 * auVar87._8_4_ | (uint)!bVar65 * auVar88._8_4_);
      bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar65 * auVar87._12_4_ | (uint)!bVar65 * auVar88._12_4_);
      bVar65 = (bool)((byte)(uVar73 >> 4) & 1);
      auVar108._16_4_ = (float)((uint)bVar65 * auVar87._16_4_ | (uint)!bVar65 * auVar88._16_4_);
      bVar65 = (bool)((byte)(uVar73 >> 5) & 1);
      auVar108._20_4_ = (float)((uint)bVar65 * auVar87._20_4_ | (uint)!bVar65 * auVar88._20_4_);
      bVar65 = (bool)((byte)(uVar73 >> 6) & 1);
      auVar108._24_4_ = (float)((uint)bVar65 * auVar87._24_4_ | (uint)!bVar65 * auVar88._24_4_);
      bVar65 = SUB81(uVar73 >> 7,0);
      auVar108._28_4_ = (uint)bVar65 * auVar87._28_4_ | (uint)!bVar65 * auVar88._28_4_;
      auVar109._0_4_ =
           (uint)(bVar66 & 1) * (int)auVar78._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar89._0_4_;
      bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar109._4_4_ = (uint)bVar65 * (int)auVar78._4_4_ | (uint)!bVar65 * auVar89._4_4_;
      bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar109._8_4_ = (uint)bVar65 * (int)auVar78._8_4_ | (uint)!bVar65 * auVar89._8_4_;
      bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar109._12_4_ = (uint)bVar65 * (int)auVar78._12_4_ | (uint)!bVar65 * auVar89._12_4_;
      auVar109._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar89._16_4_;
      auVar109._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar89._20_4_;
      auVar109._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar89._24_4_;
      auVar109._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar89._28_4_;
      bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar110._0_4_ = (uint)(bVar66 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar7._0_4_
      ;
      bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar7._4_4_;
      bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar7._8_4_;
      bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar7._12_4_;
      auVar110._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar92._16_4_;
      auVar110._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar92._20_4_;
      auVar110._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar92._24_4_;
      iVar3 = (uint)(byte)(uVar73 >> 7) * auVar92._28_4_;
      auVar110._28_4_ = iVar3;
      auVar93 = vsubps_avx512vl(auVar109,auVar100);
      auVar87 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar80._12_4_ |
                                              (uint)!bVar16 * auVar75._12_4_,
                                              CONCAT48((uint)bVar14 * (int)auVar80._8_4_ |
                                                       (uint)!bVar14 * auVar75._8_4_,
                                                       CONCAT44((uint)bVar65 * (int)auVar80._4_4_ |
                                                                (uint)!bVar65 * auVar75._4_4_,
                                                                (uint)(bVar66 & 1) *
                                                                (int)auVar80._0_4_ |
                                                                (uint)!(bool)(bVar66 & 1) *
                                                                auVar75._0_4_)))),auVar99);
      auVar88 = vsubps_avx(auVar110,auVar105);
      auVar89 = vsubps_avx(auVar100,auVar106);
      auVar92 = vsubps_avx(auVar99,auVar107);
      auVar91 = vsubps_avx(auVar105,auVar108);
      auVar37._4_4_ = auVar88._4_4_ * fVar124;
      auVar37._0_4_ = auVar88._0_4_ * fVar74;
      auVar37._8_4_ = auVar88._8_4_ * fVar126;
      auVar37._12_4_ = auVar88._12_4_ * fVar128;
      auVar37._16_4_ = auVar88._16_4_ * 0.0;
      auVar37._20_4_ = auVar88._20_4_ * 0.0;
      auVar37._24_4_ = auVar88._24_4_ * 0.0;
      auVar37._28_4_ = iVar3;
      auVar79 = vfmsub231ps_fma(auVar37,auVar105,auVar93);
      auVar38._4_4_ = fVar125 * auVar93._4_4_;
      auVar38._0_4_ = fVar145 * auVar93._0_4_;
      auVar38._8_4_ = fVar127 * auVar93._8_4_;
      auVar38._12_4_ = fVar129 * auVar93._12_4_;
      auVar38._16_4_ = auVar93._16_4_ * 0.0;
      auVar38._20_4_ = auVar93._20_4_ * 0.0;
      auVar38._24_4_ = auVar93._24_4_ * 0.0;
      auVar38._28_4_ = auVar90._28_4_;
      auVar76 = vfmsub231ps_fma(auVar38,auVar100,auVar87);
      auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar86,ZEXT1632(auVar79));
      auVar153._0_4_ = auVar87._0_4_ * auVar105._0_4_;
      auVar153._4_4_ = auVar87._4_4_ * auVar105._4_4_;
      auVar153._8_4_ = auVar87._8_4_ * auVar105._8_4_;
      auVar153._12_4_ = auVar87._12_4_ * auVar105._12_4_;
      auVar153._16_4_ = auVar87._16_4_ * fVar140;
      auVar153._20_4_ = auVar87._20_4_ * fVar139;
      auVar153._24_4_ = auVar87._24_4_ * fVar132;
      auVar153._28_4_ = 0;
      auVar79 = vfmsub231ps_fma(auVar153,auVar99,auVar88);
      auVar94 = vfmadd231ps_avx512vl(auVar90,auVar86,ZEXT1632(auVar79));
      auVar90 = vmulps_avx512vl(auVar91,auVar106);
      auVar90 = vfmsub231ps_avx512vl(auVar90,auVar89,auVar108);
      auVar39._4_4_ = auVar92._4_4_ * auVar108._4_4_;
      auVar39._0_4_ = auVar92._0_4_ * auVar108._0_4_;
      auVar39._8_4_ = auVar92._8_4_ * auVar108._8_4_;
      auVar39._12_4_ = auVar92._12_4_ * auVar108._12_4_;
      auVar39._16_4_ = auVar92._16_4_ * auVar108._16_4_;
      auVar39._20_4_ = auVar92._20_4_ * auVar108._20_4_;
      auVar39._24_4_ = auVar92._24_4_ * auVar108._24_4_;
      auVar39._28_4_ = auVar108._28_4_;
      auVar79 = vfmsub231ps_fma(auVar39,auVar107,auVar91);
      auVar154._0_4_ = auVar107._0_4_ * auVar89._0_4_;
      auVar154._4_4_ = auVar107._4_4_ * auVar89._4_4_;
      auVar154._8_4_ = auVar107._8_4_ * auVar89._8_4_;
      auVar154._12_4_ = auVar107._12_4_ * auVar89._12_4_;
      auVar154._16_4_ = fVar161 * auVar89._16_4_;
      auVar154._20_4_ = fVar160 * auVar89._20_4_;
      auVar154._24_4_ = fVar159 * auVar89._24_4_;
      auVar154._28_4_ = 0;
      auVar76 = vfmsub231ps_fma(auVar154,auVar92,auVar106);
      auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar86,auVar90);
      auVar95 = vfmadd231ps_avx512vl(auVar90,auVar86,ZEXT1632(auVar79));
      auVar90 = vmaxps_avx(auVar94,auVar95);
      uVar141 = vcmpps_avx512vl(auVar90,auVar86,2);
      bVar72 = bVar72 & (byte)uVar141;
      auVar179 = ZEXT3264(local_3e0);
      auVar180 = ZEXT3264(local_400);
      auVar181 = ZEXT3264(local_420);
      auVar176 = ZEXT3264(local_560);
      auVar172 = ZEXT1664(auVar77);
      if (bVar72 == 0) {
        bVar65 = false;
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar185 = ZEXT3264(auVar90);
        auVar182 = ZEXT3264(local_4e0);
        auVar183 = ZEXT3264(local_4a0);
        auVar184 = ZEXT3264(local_4c0);
      }
      else {
        auVar40._4_4_ = auVar91._4_4_ * auVar87._4_4_;
        auVar40._0_4_ = auVar91._0_4_ * auVar87._0_4_;
        auVar40._8_4_ = auVar91._8_4_ * auVar87._8_4_;
        auVar40._12_4_ = auVar91._12_4_ * auVar87._12_4_;
        auVar40._16_4_ = auVar91._16_4_ * auVar87._16_4_;
        auVar40._20_4_ = auVar91._20_4_ * auVar87._20_4_;
        auVar40._24_4_ = auVar91._24_4_ * auVar87._24_4_;
        auVar40._28_4_ = auVar90._28_4_;
        auVar75 = vfmsub231ps_fma(auVar40,auVar92,auVar88);
        auVar41._4_4_ = auVar88._4_4_ * auVar89._4_4_;
        auVar41._0_4_ = auVar88._0_4_ * auVar89._0_4_;
        auVar41._8_4_ = auVar88._8_4_ * auVar89._8_4_;
        auVar41._12_4_ = auVar88._12_4_ * auVar89._12_4_;
        auVar41._16_4_ = auVar88._16_4_ * auVar89._16_4_;
        auVar41._20_4_ = auVar88._20_4_ * auVar89._20_4_;
        auVar41._24_4_ = auVar88._24_4_ * auVar89._24_4_;
        auVar41._28_4_ = auVar88._28_4_;
        auVar76 = vfmsub231ps_fma(auVar41,auVar93,auVar91);
        auVar42._4_4_ = auVar92._4_4_ * auVar93._4_4_;
        auVar42._0_4_ = auVar92._0_4_ * auVar93._0_4_;
        auVar42._8_4_ = auVar92._8_4_ * auVar93._8_4_;
        auVar42._12_4_ = auVar92._12_4_ * auVar93._12_4_;
        auVar42._16_4_ = auVar92._16_4_ * auVar93._16_4_;
        auVar42._20_4_ = auVar92._20_4_ * auVar93._20_4_;
        auVar42._24_4_ = auVar92._24_4_ * auVar93._24_4_;
        auVar42._28_4_ = auVar92._28_4_;
        auVar7 = vfmsub231ps_fma(auVar42,auVar89,auVar87);
        auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar76),ZEXT1632(auVar7));
        auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar75),auVar86);
        auVar87 = vrcp14ps_avx512vl(auVar90);
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar185 = ZEXT3264(auVar88);
        auVar89 = vfnmadd213ps_avx512vl(auVar87,auVar90,auVar88);
        auVar79 = vfmadd132ps_fma(auVar89,auVar87,auVar87);
        auVar43._4_4_ = auVar7._4_4_ * auVar105._4_4_;
        auVar43._0_4_ = auVar7._0_4_ * auVar105._0_4_;
        auVar43._8_4_ = auVar7._8_4_ * auVar105._8_4_;
        auVar43._12_4_ = auVar7._12_4_ * auVar105._12_4_;
        auVar43._16_4_ = fVar140 * 0.0;
        auVar43._20_4_ = fVar139 * 0.0;
        auVar43._24_4_ = fVar132 * 0.0;
        auVar43._28_4_ = iVar2;
        auVar76 = vfmadd231ps_fma(auVar43,auVar99,ZEXT1632(auVar76));
        auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar100,ZEXT1632(auVar75));
        fVar132 = auVar79._0_4_;
        fVar139 = auVar79._4_4_;
        fVar140 = auVar79._8_4_;
        fVar160 = auVar79._12_4_;
        local_240 = ZEXT1632(CONCAT412(auVar76._12_4_ * fVar160,
                                       CONCAT48(auVar76._8_4_ * fVar140,
                                                CONCAT44(auVar76._4_4_ * fVar139,
                                                         auVar76._0_4_ * fVar132))));
        auVar162._4_4_ = uVar133;
        auVar162._0_4_ = uVar133;
        auVar162._8_4_ = uVar133;
        auVar162._12_4_ = uVar133;
        auVar162._16_4_ = uVar133;
        auVar162._20_4_ = uVar133;
        auVar162._24_4_ = uVar133;
        auVar162._28_4_ = uVar133;
        uVar141 = vcmpps_avx512vl(auVar162,local_240,2);
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar22._4_4_ = uVar4;
        auVar22._0_4_ = uVar4;
        auVar22._8_4_ = uVar4;
        auVar22._12_4_ = uVar4;
        auVar22._16_4_ = uVar4;
        auVar22._20_4_ = uVar4;
        auVar22._24_4_ = uVar4;
        auVar22._28_4_ = uVar4;
        uVar19 = vcmpps_avx512vl(local_240,auVar22,2);
        bVar72 = (byte)uVar141 & (byte)uVar19 & bVar72;
        auVar183 = ZEXT3264(local_4a0);
        auVar184 = ZEXT3264(local_4c0);
        if (bVar72 == 0) {
          bVar65 = false;
          auVar182 = ZEXT3264(local_4e0);
        }
        else {
          uVar141 = vcmpps_avx512vl(auVar90,auVar86,4);
          bVar72 = bVar72 & (byte)uVar141;
          auVar163 = ZEXT1664(local_5c0);
          auVar182 = ZEXT3264(local_4e0);
          if (bVar72 != 0) {
            fVar159 = auVar94._0_4_ * fVar132;
            fVar161 = auVar94._4_4_ * fVar139;
            auVar44._4_4_ = fVar161;
            auVar44._0_4_ = fVar159;
            fVar74 = auVar94._8_4_ * fVar140;
            auVar44._8_4_ = fVar74;
            fVar145 = auVar94._12_4_ * fVar160;
            auVar44._12_4_ = fVar145;
            fVar124 = auVar94._16_4_ * 0.0;
            auVar44._16_4_ = fVar124;
            fVar125 = auVar94._20_4_ * 0.0;
            auVar44._20_4_ = fVar125;
            fVar126 = auVar94._24_4_ * 0.0;
            auVar44._24_4_ = fVar126;
            auVar44._28_4_ = auVar90._28_4_;
            auVar87 = vsubps_avx512vl(auVar88,auVar44);
            local_280._0_4_ =
                 (float)((uint)(bVar66 & 1) * (int)fVar159 |
                        (uint)!(bool)(bVar66 & 1) * auVar87._0_4_);
            bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar65 * (int)fVar161 | (uint)!bVar65 * auVar87._4_4_);
            bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar65 * (int)fVar74 | (uint)!bVar65 * auVar87._8_4_);
            bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar65 * (int)fVar145 | (uint)!bVar65 * auVar87._12_4_)
            ;
            bVar65 = (bool)((byte)(uVar73 >> 4) & 1);
            local_280._16_4_ = (float)((uint)bVar65 * (int)fVar124 | (uint)!bVar65 * auVar87._16_4_)
            ;
            bVar65 = (bool)((byte)(uVar73 >> 5) & 1);
            local_280._20_4_ = (float)((uint)bVar65 * (int)fVar125 | (uint)!bVar65 * auVar87._20_4_)
            ;
            bVar65 = (bool)((byte)(uVar73 >> 6) & 1);
            local_280._24_4_ = (float)((uint)bVar65 * (int)fVar126 | (uint)!bVar65 * auVar87._24_4_)
            ;
            bVar65 = SUB81(uVar73 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar65 * auVar90._28_4_ | (uint)!bVar65 * auVar87._28_4_);
            auVar90 = vsubps_avx(ZEXT1632(auVar10),auVar96);
            auVar79 = vfmadd213ps_fma(auVar90,local_280,auVar96);
            uVar4 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
            auVar23._4_4_ = uVar4;
            auVar23._0_4_ = uVar4;
            auVar23._8_4_ = uVar4;
            auVar23._12_4_ = uVar4;
            auVar23._16_4_ = uVar4;
            auVar23._20_4_ = uVar4;
            auVar23._24_4_ = uVar4;
            auVar23._28_4_ = uVar4;
            auVar90 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                         CONCAT48(auVar79._8_4_ + auVar79._8_4_,
                                                                  CONCAT44(auVar79._4_4_ +
                                                                           auVar79._4_4_,
                                                                           auVar79._0_4_ +
                                                                           auVar79._0_4_)))),auVar23
                                     );
            uVar141 = vcmpps_avx512vl(local_240,auVar90,6);
            if (((byte)uVar141 & bVar72) != 0) {
              auVar151._0_4_ = auVar95._0_4_ * fVar132;
              auVar151._4_4_ = auVar95._4_4_ * fVar139;
              auVar151._8_4_ = auVar95._8_4_ * fVar140;
              auVar151._12_4_ = auVar95._12_4_ * fVar160;
              auVar151._16_4_ = auVar95._16_4_ * 0.0;
              auVar151._20_4_ = auVar95._20_4_ * 0.0;
              auVar151._24_4_ = auVar95._24_4_ * 0.0;
              auVar151._28_4_ = 0;
              auVar90 = vsubps_avx512vl(auVar88,auVar151);
              auVar111._0_4_ =
                   (uint)(bVar66 & 1) * (int)auVar151._0_4_ |
                   (uint)!(bool)(bVar66 & 1) * auVar90._0_4_;
              bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
              auVar111._4_4_ = (uint)bVar65 * (int)auVar151._4_4_ | (uint)!bVar65 * auVar90._4_4_;
              bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
              auVar111._8_4_ = (uint)bVar65 * (int)auVar151._8_4_ | (uint)!bVar65 * auVar90._8_4_;
              bVar65 = (bool)((byte)(uVar73 >> 3) & 1);
              auVar111._12_4_ = (uint)bVar65 * (int)auVar151._12_4_ | (uint)!bVar65 * auVar90._12_4_
              ;
              bVar65 = (bool)((byte)(uVar73 >> 4) & 1);
              auVar111._16_4_ = (uint)bVar65 * (int)auVar151._16_4_ | (uint)!bVar65 * auVar90._16_4_
              ;
              bVar65 = (bool)((byte)(uVar73 >> 5) & 1);
              auVar111._20_4_ = (uint)bVar65 * (int)auVar151._20_4_ | (uint)!bVar65 * auVar90._20_4_
              ;
              bVar65 = (bool)((byte)(uVar73 >> 6) & 1);
              auVar111._24_4_ = (uint)bVar65 * (int)auVar151._24_4_ | (uint)!bVar65 * auVar90._24_4_
              ;
              auVar111._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar90._28_4_;
              auVar24._8_4_ = 0x40000000;
              auVar24._0_8_ = 0x4000000040000000;
              auVar24._12_4_ = 0x40000000;
              auVar24._16_4_ = 0x40000000;
              auVar24._20_4_ = 0x40000000;
              auVar24._24_4_ = 0x40000000;
              auVar24._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar111,auVar88,auVar24);
              local_220 = 0;
              local_200 = local_4f0._0_8_;
              uStack_1f8 = local_4f0._8_8_;
              local_1f0 = local_500._0_8_;
              uStack_1e8 = local_500._8_8_;
              if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar65 = true, pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_019b59ce;
                fVar146 = 1.0 / fVar146;
                local_1c0[0] = fVar146 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar146 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar146 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar146 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar146 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar146 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar146 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                local_440 = (float)(uint)((byte)uVar141 & bVar72);
                lVar71 = 0;
                for (uVar73 = (ulong)(uint)local_440; (uVar73 & 1) == 0;
                    uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                  lVar71 = lVar71 + 1;
                }
                local_3c0._0_8_ = lVar71;
                _local_2a0 = vpbroadcastd_avx512vl();
                uVar73 = (ulong)(uint)local_440;
                local_5b0 = auVar77;
                local_21c = iVar20;
                local_210 = local_5c0;
                while( true ) {
                  local_440 = auVar172._0_4_;
                  auVar77 = auVar178._0_16_;
                  if (uVar73 == 0) break;
                  local_440 = (float)uVar73;
                  fStack_43c = (float)(uVar73 >> 0x20);
                  local_360 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_300 = local_1c0[local_3c0._0_8_];
                  local_2f0 = *(undefined4 *)(local_1a0 + local_3c0._0_8_ * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) =
                       *(undefined4 *)(local_180 + local_3c0._0_8_ * 4);
                  local_590.context = context->user;
                  fVar132 = 1.0 - local_300;
                  fVar146 = fVar132 * fVar132 * -3.0;
                  auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * fVar132)),
                                            ZEXT416((uint)(local_300 * fVar132)),ZEXT416(0xc0000000)
                                           );
                  auVar76 = vfmsub132ss_fma(ZEXT416((uint)(local_300 * fVar132)),
                                            ZEXT416((uint)(local_300 * local_300)),
                                            ZEXT416(0x40000000));
                  fVar132 = auVar79._0_4_ * 3.0;
                  fVar139 = auVar76._0_4_ * 3.0;
                  fVar140 = local_300 * local_300 * 3.0;
                  auVar157._0_4_ = fVar140 * (float)local_370._0_4_;
                  auVar157._4_4_ = fVar140 * (float)local_370._4_4_;
                  auVar157._8_4_ = fVar140 * fStack_368;
                  auVar157._12_4_ = fVar140 * fStack_364;
                  auVar134._4_4_ = fVar139;
                  auVar134._0_4_ = fVar139;
                  auVar134._8_4_ = fVar139;
                  auVar134._12_4_ = fVar139;
                  auVar79 = vfmadd132ps_fma(auVar134,auVar157,local_500);
                  auVar149._4_4_ = fVar132;
                  auVar149._0_4_ = fVar132;
                  auVar149._8_4_ = fVar132;
                  auVar149._12_4_ = fVar132;
                  auVar79 = vfmadd132ps_fma(auVar149,auVar79,local_4f0);
                  auVar135._4_4_ = fVar146;
                  auVar135._0_4_ = fVar146;
                  auVar135._8_4_ = fVar146;
                  auVar135._12_4_ = fVar146;
                  auVar79 = vfmadd213ps_fma(auVar135,auVar163._0_16_,auVar79);
                  local_330 = auVar79._0_4_;
                  local_320 = vshufps_avx(auVar79,auVar79,0x55);
                  local_310 = vshufps_avx(auVar79,auVar79,0xaa);
                  local_2e0 = local_380._0_8_;
                  uStack_2d8 = local_380._8_8_;
                  local_2d0 = _local_2a0;
                  vpcmpeqd_avx2(ZEXT1632(_local_2a0),ZEXT1632(_local_2a0));
                  uStack_2bc = (local_590.context)->instID[0];
                  local_2c0 = uStack_2bc;
                  uStack_2b8 = uStack_2bc;
                  uStack_2b4 = uStack_2bc;
                  uStack_2b0 = (local_590.context)->instPrimID[0];
                  uStack_2ac = uStack_2b0;
                  uStack_2a8 = uStack_2b0;
                  uStack_2a4 = uStack_2b0;
                  local_5e0 = local_390;
                  local_590.valid = (int *)local_5e0;
                  local_590.geometryUserPtr = pGVar11->userPtr;
                  local_590.hit = (RTCHitN *)&local_330;
                  local_590.N = 4;
                  local_590.ray = (RTCRayN *)ray;
                  uStack_32c = local_330;
                  uStack_328 = local_330;
                  uStack_324 = local_330;
                  fStack_2fc = local_300;
                  fStack_2f8 = local_300;
                  fStack_2f4 = local_300;
                  uStack_2ec = local_2f0;
                  uStack_2e8 = local_2f0;
                  uStack_2e4 = local_2f0;
                  if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar11->occlusionFilterN)(&local_590);
                    auVar172 = ZEXT1664(local_5b0);
                    auVar184 = ZEXT3264(local_4c0);
                    auVar183 = ZEXT3264(local_4a0);
                    auVar182 = ZEXT3264(local_4e0);
                    auVar176 = ZEXT3264(local_560);
                    auVar177 = ZEXT3264(local_540);
                    auVar181 = ZEXT3264(local_420);
                    auVar180 = ZEXT3264(local_400);
                    auVar179 = ZEXT3264(local_3e0);
                    auVar163 = ZEXT1664(local_5c0);
                    auVar77 = vxorps_avx512vl(auVar77,auVar77);
                    auVar178 = ZEXT1664(auVar77);
                    auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar185 = ZEXT3264(auVar90);
                  }
                  auVar77 = auVar178._0_16_;
                  uVar73 = vptestmd_avx512vl(local_5e0,local_5e0);
                  if ((uVar73 & 0xf) != 0) {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_590);
                      auVar172 = ZEXT1664(local_5b0);
                      auVar184 = ZEXT3264(local_4c0);
                      auVar183 = ZEXT3264(local_4a0);
                      auVar182 = ZEXT3264(local_4e0);
                      auVar176 = ZEXT3264(local_560);
                      auVar177 = ZEXT3264(local_540);
                      auVar181 = ZEXT3264(local_420);
                      auVar180 = ZEXT3264(local_400);
                      auVar179 = ZEXT3264(local_3e0);
                      auVar163 = ZEXT1664(local_5c0);
                      auVar77 = vxorps_avx512vl(auVar77,auVar77);
                      auVar178 = ZEXT1664(auVar77);
                      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar185 = ZEXT3264(auVar90);
                    }
                    auVar77 = *(undefined1 (*) [16])(local_590.ray + 0x80);
                    uVar73 = vptestmd_avx512vl(local_5e0,local_5e0);
                    uVar73 = uVar73 & 0xf;
                    auVar79 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar65 = (bool)((byte)uVar73 & 1);
                    auVar82._0_4_ = (uint)bVar65 * auVar79._0_4_ | (uint)!bVar65 * auVar77._0_4_;
                    bVar65 = (bool)((byte)(uVar73 >> 1) & 1);
                    auVar82._4_4_ = (uint)bVar65 * auVar79._4_4_ | (uint)!bVar65 * auVar77._4_4_;
                    bVar65 = (bool)((byte)(uVar73 >> 2) & 1);
                    auVar82._8_4_ = (uint)bVar65 * auVar79._8_4_ | (uint)!bVar65 * auVar77._8_4_;
                    bVar65 = SUB81(uVar73 >> 3,0);
                    auVar82._12_4_ = (uint)bVar65 * auVar79._12_4_ | (uint)!bVar65 * auVar77._12_4_;
                    *(undefined1 (*) [16])(local_590.ray + 0x80) = auVar82;
                    if ((byte)uVar73 != 0) {
                      bVar65 = true;
                      local_440 = auVar172._0_4_;
                      goto LAB_019b59ce;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_360;
                  lVar71 = 0;
                  uVar73 = CONCAT44(fStack_43c,local_440) ^ 1L << (local_3c0._0_8_ & 0x3f);
                  for (uVar21 = uVar73; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000
                      ) {
                    lVar71 = lVar71 + 1;
                  }
                  local_3c0._0_8_ = lVar71;
                }
              }
            }
          }
          bVar65 = false;
        }
      }
    }
LAB_019b59ce:
    if (8 < iVar20) {
      local_3c0 = vpbroadcastd_avx512vl();
      fStack_290 = 1.0 / (float)local_510._0_4_;
      local_2a0._4_4_ = fStack_290;
      local_2a0._0_4_ = fStack_290;
      fStack_298 = fStack_290;
      fStack_294 = fStack_290;
      local_510 = vpbroadcastd_avx512vl();
      fStack_43c = local_440;
      fStack_438 = local_440;
      fStack_434 = local_440;
      fStack_430 = local_440;
      fStack_42c = local_440;
      fStack_428 = local_440;
      fStack_424 = local_440;
      local_360 = uVar133;
      uStack_35c = uVar133;
      uStack_358 = uVar133;
      uStack_354 = uVar133;
      uStack_350 = uVar133;
      uStack_34c = uVar133;
      uStack_348 = uVar133;
      uStack_344 = uVar133;
      fStack_28c = fStack_290;
      fStack_288 = fStack_290;
      fStack_284 = fStack_290;
      for (lVar71 = 8; lVar71 < local_450; lVar71 = lVar71 + 8) {
        auVar90 = vpbroadcastd_avx512vl();
        auVar92 = vpor_avx2(auVar90,_DAT_01fb4ba0);
        uVar19 = vpcmpd_avx512vl(auVar92,local_3c0,1);
        auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar71 * 4 + lVar70);
        auVar87 = *(undefined1 (*) [32])(lVar70 + 0x21fb768 + lVar71 * 4);
        auVar88 = *(undefined1 (*) [32])(lVar70 + 0x21fbbec + lVar71 * 4);
        auVar89 = *(undefined1 (*) [32])(lVar70 + 0x21fc070 + lVar71 * 4);
        local_4a0 = auVar183._0_32_;
        auVar91 = vmulps_avx512vl(local_4a0,auVar89);
        local_4c0 = auVar184._0_32_;
        auVar100 = vmulps_avx512vl(local_4c0,auVar89);
        auVar45._4_4_ = auVar89._4_4_ * (float)local_100._4_4_;
        auVar45._0_4_ = auVar89._0_4_ * (float)local_100._0_4_;
        auVar45._8_4_ = auVar89._8_4_ * fStack_f8;
        auVar45._12_4_ = auVar89._12_4_ * fStack_f4;
        auVar45._16_4_ = auVar89._16_4_ * fStack_f0;
        auVar45._20_4_ = auVar89._20_4_ * fStack_ec;
        auVar45._24_4_ = auVar89._24_4_ * fStack_e8;
        auVar45._28_4_ = auVar92._28_4_;
        auVar95 = auVar176._0_32_;
        auVar92 = vfmadd231ps_avx512vl(auVar91,auVar88,auVar95);
        local_4e0 = auVar182._0_32_;
        auVar91 = vfmadd231ps_avx512vl(auVar100,auVar88,local_4e0);
        auVar100 = vfmadd231ps_avx512vl(auVar45,auVar88,local_e0);
        auVar170 = auVar181._0_32_;
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar87,auVar170);
        auVar86 = auVar177._0_32_;
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar87,auVar86);
        auVar77 = vfmadd231ps_fma(auVar100,auVar87,local_c0);
        local_3e0 = auVar179._0_32_;
        auVar84 = vfmadd231ps_avx512vl(auVar92,auVar90,local_3e0);
        auVar164 = auVar180._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar91,auVar90,auVar164);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar71 * 4 + lVar70);
        auVar91 = *(undefined1 (*) [32])(lVar70 + 0x21fdb88 + lVar71 * 4);
        auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar90,local_a0);
        auVar100 = *(undefined1 (*) [32])(lVar70 + 0x21fe00c + lVar71 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar70 + 0x21fe490 + lVar71 * 4);
        auVar93 = vmulps_avx512vl(local_4a0,auVar99);
        auVar94 = vmulps_avx512vl(local_4c0,auVar99);
        auVar46._4_4_ = auVar99._4_4_ * (float)local_100._4_4_;
        auVar46._0_4_ = auVar99._0_4_ * (float)local_100._0_4_;
        auVar46._8_4_ = auVar99._8_4_ * fStack_f8;
        auVar46._12_4_ = auVar99._12_4_ * fStack_f4;
        auVar46._16_4_ = auVar99._16_4_ * fStack_f0;
        auVar46._20_4_ = auVar99._20_4_ * fStack_ec;
        auVar46._24_4_ = auVar99._24_4_ * fStack_e8;
        auVar46._28_4_ = uStack_e4;
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,auVar95);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,local_4e0);
        auVar96 = vfmadd231ps_avx512vl(auVar46,auVar100,local_e0);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar170);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,auVar86);
        auVar79 = vfmadd231ps_fma(auVar96,auVar91,local_c0);
        auVar96 = vfmadd231ps_avx512vl(auVar93,auVar92,local_3e0);
        auVar97 = vfmadd231ps_avx512vl(auVar94,auVar92,auVar164);
        auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar92,local_a0);
        auVar98 = vmaxps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar79));
        auVar93 = vsubps_avx(auVar96,auVar84);
        auVar94 = vsubps_avx(auVar97,auVar85);
        auVar112 = vmulps_avx512vl(auVar85,auVar93);
        auVar113 = vmulps_avx512vl(auVar84,auVar94);
        auVar112 = vsubps_avx512vl(auVar112,auVar113);
        auVar113 = vmulps_avx512vl(auVar94,auVar94);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar93,auVar93);
        auVar98 = vmulps_avx512vl(auVar98,auVar98);
        auVar98 = vmulps_avx512vl(auVar98,auVar113);
        auVar112 = vmulps_avx512vl(auVar112,auVar112);
        uVar141 = vcmpps_avx512vl(auVar112,auVar98,2);
        bVar72 = (byte)uVar19 & (byte)uVar141;
        if (bVar72 == 0) {
LAB_019b6450:
          auVar177 = ZEXT3264(auVar86);
          auVar176 = ZEXT3264(auVar95);
        }
        else {
          auVar99 = vmulps_avx512vl(local_480,auVar99);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_160,auVar99);
          auVar91 = vfmadd213ps_avx512vl(auVar91,local_140,auVar100);
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_120,auVar91);
          auVar89 = vmulps_avx512vl(local_480,auVar89);
          auVar88 = vfmadd213ps_avx512vl(auVar88,local_160,auVar89);
          auVar87 = vfmadd213ps_avx512vl(auVar87,local_140,auVar88);
          auVar91 = vfmadd213ps_avx512vl(auVar90,local_120,auVar87);
          auVar90 = *(undefined1 (*) [32])(lVar70 + 0x21fc4f4 + lVar71 * 4);
          auVar87 = *(undefined1 (*) [32])(lVar70 + 0x21fc978 + lVar71 * 4);
          auVar88 = *(undefined1 (*) [32])(lVar70 + 0x21fcdfc + lVar71 * 4);
          auVar89 = *(undefined1 (*) [32])(lVar70 + 0x21fd280 + lVar71 * 4);
          auVar100 = vmulps_avx512vl(local_4a0,auVar89);
          auVar99 = vmulps_avx512vl(local_4c0,auVar89);
          auVar89 = vmulps_avx512vl(local_480,auVar89);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar88,auVar95);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar88,local_4e0);
          auVar88 = vfmadd231ps_avx512vl(auVar89,local_160,auVar88);
          auVar89 = vfmadd231ps_avx512vl(auVar100,auVar87,auVar170);
          auVar100 = vfmadd231ps_avx512vl(auVar99,auVar87,auVar86);
          auVar87 = vfmadd231ps_avx512vl(auVar88,local_140,auVar87);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar90,local_3e0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar90,auVar164);
          auVar99 = vfmadd231ps_avx512vl(auVar87,local_120,auVar90);
          auVar90 = *(undefined1 (*) [32])(lVar70 + 0x21fe914 + lVar71 * 4);
          auVar87 = *(undefined1 (*) [32])(lVar70 + 0x21ff21c + lVar71 * 4);
          auVar88 = *(undefined1 (*) [32])(lVar70 + 0x21ff6a0 + lVar71 * 4);
          auVar98 = vmulps_avx512vl(local_4a0,auVar88);
          auVar112 = vmulps_avx512vl(local_4c0,auVar88);
          auVar88 = vmulps_avx512vl(local_480,auVar88);
          auVar95 = vfmadd231ps_avx512vl(auVar98,auVar87,auVar95);
          auVar98 = vfmadd231ps_avx512vl(auVar112,auVar87,local_4e0);
          auVar88 = vfmadd231ps_avx512vl(auVar88,local_160,auVar87);
          auVar87 = *(undefined1 (*) [32])(lVar70 + 0x21fed98 + lVar71 * 4);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar87,auVar170);
          auVar86 = vfmadd231ps_avx512vl(auVar98,auVar87,auVar86);
          auVar87 = vfmadd231ps_avx512vl(auVar88,local_140,auVar87);
          auVar88 = vfmadd231ps_avx512vl(auVar95,auVar90,local_3e0);
          auVar95 = vfmadd231ps_avx512vl(auVar86,auVar90,auVar164);
          auVar87 = vfmadd231ps_avx512vl(auVar87,local_120,auVar90);
          auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar89,auVar86);
          vandps_avx512vl(auVar100,auVar86);
          auVar90 = vmaxps_avx(auVar86,auVar86);
          vandps_avx512vl(auVar99,auVar86);
          auVar90 = vmaxps_avx(auVar90,auVar86);
          auVar63._4_4_ = fStack_43c;
          auVar63._0_4_ = local_440;
          auVar63._8_4_ = fStack_438;
          auVar63._12_4_ = fStack_434;
          auVar63._16_4_ = fStack_430;
          auVar63._20_4_ = fStack_42c;
          auVar63._24_4_ = fStack_428;
          auVar63._28_4_ = fStack_424;
          uVar73 = vcmpps_avx512vl(auVar90,auVar63,1);
          bVar13 = (bool)((byte)uVar73 & 1);
          auVar114._0_4_ = (float)((uint)bVar13 * auVar93._0_4_ | (uint)!bVar13 * auVar89._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar114._4_4_ = (float)((uint)bVar13 * auVar93._4_4_ | (uint)!bVar13 * auVar89._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar114._8_4_ = (float)((uint)bVar13 * auVar93._8_4_ | (uint)!bVar13 * auVar89._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar114._12_4_ = (float)((uint)bVar13 * auVar93._12_4_ | (uint)!bVar13 * auVar89._12_4_);
          bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar114._16_4_ = (float)((uint)bVar13 * auVar93._16_4_ | (uint)!bVar13 * auVar89._16_4_);
          bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar114._20_4_ = (float)((uint)bVar13 * auVar93._20_4_ | (uint)!bVar13 * auVar89._20_4_);
          bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar114._24_4_ = (float)((uint)bVar13 * auVar93._24_4_ | (uint)!bVar13 * auVar89._24_4_);
          bVar13 = SUB81(uVar73 >> 7,0);
          auVar114._28_4_ = (uint)bVar13 * auVar93._28_4_ | (uint)!bVar13 * auVar89._28_4_;
          bVar13 = (bool)((byte)uVar73 & 1);
          auVar115._0_4_ = (float)((uint)bVar13 * auVar94._0_4_ | (uint)!bVar13 * auVar100._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar13 * auVar94._4_4_ | (uint)!bVar13 * auVar100._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar13 * auVar94._8_4_ | (uint)!bVar13 * auVar100._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar13 * auVar94._12_4_ | (uint)!bVar13 * auVar100._12_4_)
          ;
          bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar13 * auVar94._16_4_ | (uint)!bVar13 * auVar100._16_4_)
          ;
          bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar13 * auVar94._20_4_ | (uint)!bVar13 * auVar100._20_4_)
          ;
          bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar13 * auVar94._24_4_ | (uint)!bVar13 * auVar100._24_4_)
          ;
          bVar13 = SUB81(uVar73 >> 7,0);
          auVar115._28_4_ = (uint)bVar13 * auVar94._28_4_ | (uint)!bVar13 * auVar100._28_4_;
          vandps_avx512vl(auVar88,auVar86);
          vandps_avx512vl(auVar95,auVar86);
          auVar90 = vmaxps_avx(auVar115,auVar115);
          vandps_avx512vl(auVar87,auVar86);
          auVar90 = vmaxps_avx(auVar90,auVar115);
          uVar73 = vcmpps_avx512vl(auVar90,auVar63,1);
          bVar13 = (bool)((byte)uVar73 & 1);
          auVar116._0_4_ = (uint)bVar13 * auVar93._0_4_ | (uint)!bVar13 * auVar88._0_4_;
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar116._4_4_ = (uint)bVar13 * auVar93._4_4_ | (uint)!bVar13 * auVar88._4_4_;
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar116._8_4_ = (uint)bVar13 * auVar93._8_4_ | (uint)!bVar13 * auVar88._8_4_;
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar116._12_4_ = (uint)bVar13 * auVar93._12_4_ | (uint)!bVar13 * auVar88._12_4_;
          bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar116._16_4_ = (uint)bVar13 * auVar93._16_4_ | (uint)!bVar13 * auVar88._16_4_;
          bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar116._20_4_ = (uint)bVar13 * auVar93._20_4_ | (uint)!bVar13 * auVar88._20_4_;
          bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar116._24_4_ = (uint)bVar13 * auVar93._24_4_ | (uint)!bVar13 * auVar88._24_4_;
          bVar13 = SUB81(uVar73 >> 7,0);
          auVar116._28_4_ = (uint)bVar13 * auVar93._28_4_ | (uint)!bVar13 * auVar88._28_4_;
          bVar13 = (bool)((byte)uVar73 & 1);
          auVar117._0_4_ = (float)((uint)bVar13 * auVar94._0_4_ | (uint)!bVar13 * auVar95._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar13 * auVar94._4_4_ | (uint)!bVar13 * auVar95._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar13 * auVar94._8_4_ | (uint)!bVar13 * auVar95._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar13 * auVar94._12_4_ | (uint)!bVar13 * auVar95._12_4_);
          bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar13 * auVar94._16_4_ | (uint)!bVar13 * auVar95._16_4_);
          bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar13 * auVar94._20_4_ | (uint)!bVar13 * auVar95._20_4_);
          bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar13 * auVar94._24_4_ | (uint)!bVar13 * auVar95._24_4_);
          bVar13 = SUB81(uVar73 >> 7,0);
          auVar117._28_4_ = (uint)bVar13 * auVar94._28_4_ | (uint)!bVar13 * auVar95._28_4_;
          auVar166._8_4_ = 0x80000000;
          auVar166._0_8_ = 0x8000000080000000;
          auVar166._12_4_ = 0x80000000;
          auVar166._16_4_ = 0x80000000;
          auVar166._20_4_ = 0x80000000;
          auVar166._24_4_ = 0x80000000;
          auVar166._28_4_ = 0x80000000;
          auVar90 = vxorps_avx512vl(auVar116,auVar166);
          auVar98 = auVar178._0_32_;
          auVar87 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar98);
          auVar76 = vfmadd231ps_fma(auVar87,auVar115,auVar115);
          auVar87 = vrsqrt14ps_avx512vl(ZEXT1632(auVar76));
          auVar175._8_4_ = 0xbf000000;
          auVar175._0_8_ = 0xbf000000bf000000;
          auVar175._12_4_ = 0xbf000000;
          auVar175._16_4_ = 0xbf000000;
          auVar175._20_4_ = 0xbf000000;
          auVar175._24_4_ = 0xbf000000;
          auVar175._28_4_ = 0xbf000000;
          fVar146 = auVar87._0_4_;
          fVar132 = auVar87._4_4_;
          fVar139 = auVar87._8_4_;
          fVar140 = auVar87._12_4_;
          fVar160 = auVar87._16_4_;
          fVar159 = auVar87._20_4_;
          fVar161 = auVar87._24_4_;
          auVar47._4_4_ = fVar132 * fVar132 * fVar132 * auVar76._4_4_ * -0.5;
          auVar47._0_4_ = fVar146 * fVar146 * fVar146 * auVar76._0_4_ * -0.5;
          auVar47._8_4_ = fVar139 * fVar139 * fVar139 * auVar76._8_4_ * -0.5;
          auVar47._12_4_ = fVar140 * fVar140 * fVar140 * auVar76._12_4_ * -0.5;
          auVar47._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
          auVar47._20_4_ = fVar159 * fVar159 * fVar159 * -0.0;
          auVar47._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
          auVar47._28_4_ = auVar115._28_4_;
          auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar87 = vfmadd231ps_avx512vl(auVar47,auVar88,auVar87);
          auVar48._4_4_ = auVar115._4_4_ * auVar87._4_4_;
          auVar48._0_4_ = auVar115._0_4_ * auVar87._0_4_;
          auVar48._8_4_ = auVar115._8_4_ * auVar87._8_4_;
          auVar48._12_4_ = auVar115._12_4_ * auVar87._12_4_;
          auVar48._16_4_ = auVar115._16_4_ * auVar87._16_4_;
          auVar48._20_4_ = auVar115._20_4_ * auVar87._20_4_;
          auVar48._24_4_ = auVar115._24_4_ * auVar87._24_4_;
          auVar48._28_4_ = 0;
          auVar49._4_4_ = auVar87._4_4_ * -auVar114._4_4_;
          auVar49._0_4_ = auVar87._0_4_ * -auVar114._0_4_;
          auVar49._8_4_ = auVar87._8_4_ * -auVar114._8_4_;
          auVar49._12_4_ = auVar87._12_4_ * -auVar114._12_4_;
          auVar49._16_4_ = auVar87._16_4_ * -auVar114._16_4_;
          auVar49._20_4_ = auVar87._20_4_ * -auVar114._20_4_;
          auVar49._24_4_ = auVar87._24_4_ * -auVar114._24_4_;
          auVar49._28_4_ = auVar115._28_4_;
          auVar89 = vmulps_avx512vl(auVar87,auVar98);
          auVar87 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar98);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar117,auVar117);
          auVar100 = vrsqrt14ps_avx512vl(auVar87);
          auVar87 = vmulps_avx512vl(auVar87,auVar175);
          fVar146 = auVar100._0_4_;
          fVar132 = auVar100._4_4_;
          fVar139 = auVar100._8_4_;
          fVar140 = auVar100._12_4_;
          fVar160 = auVar100._16_4_;
          fVar159 = auVar100._20_4_;
          fVar161 = auVar100._24_4_;
          auVar50._4_4_ = fVar132 * fVar132 * fVar132 * auVar87._4_4_;
          auVar50._0_4_ = fVar146 * fVar146 * fVar146 * auVar87._0_4_;
          auVar50._8_4_ = fVar139 * fVar139 * fVar139 * auVar87._8_4_;
          auVar50._12_4_ = fVar140 * fVar140 * fVar140 * auVar87._12_4_;
          auVar50._16_4_ = fVar160 * fVar160 * fVar160 * auVar87._16_4_;
          auVar50._20_4_ = fVar159 * fVar159 * fVar159 * auVar87._20_4_;
          auVar50._24_4_ = fVar161 * fVar161 * fVar161 * auVar87._24_4_;
          auVar50._28_4_ = auVar87._28_4_;
          auVar87 = vfmadd231ps_avx512vl(auVar50,auVar88,auVar100);
          auVar51._4_4_ = auVar117._4_4_ * auVar87._4_4_;
          auVar51._0_4_ = auVar117._0_4_ * auVar87._0_4_;
          auVar51._8_4_ = auVar117._8_4_ * auVar87._8_4_;
          auVar51._12_4_ = auVar117._12_4_ * auVar87._12_4_;
          auVar51._16_4_ = auVar117._16_4_ * auVar87._16_4_;
          auVar51._20_4_ = auVar117._20_4_ * auVar87._20_4_;
          auVar51._24_4_ = auVar117._24_4_ * auVar87._24_4_;
          auVar51._28_4_ = auVar100._28_4_;
          auVar52._4_4_ = auVar87._4_4_ * auVar90._4_4_;
          auVar52._0_4_ = auVar87._0_4_ * auVar90._0_4_;
          auVar52._8_4_ = auVar87._8_4_ * auVar90._8_4_;
          auVar52._12_4_ = auVar87._12_4_ * auVar90._12_4_;
          auVar52._16_4_ = auVar87._16_4_ * auVar90._16_4_;
          auVar52._20_4_ = auVar87._20_4_ * auVar90._20_4_;
          auVar52._24_4_ = auVar87._24_4_ * auVar90._24_4_;
          auVar52._28_4_ = auVar90._28_4_;
          auVar90 = vmulps_avx512vl(auVar87,auVar98);
          auVar76 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar77),auVar84);
          auVar87 = ZEXT1632(auVar77);
          auVar75 = vfmadd213ps_fma(auVar49,auVar87,auVar85);
          auVar88 = vfmadd213ps_avx512vl(auVar89,auVar87,auVar91);
          auVar100 = vfmadd213ps_avx512vl(auVar51,ZEXT1632(auVar79),auVar96);
          auVar78 = vfnmadd213ps_fma(auVar48,auVar87,auVar84);
          auVar99 = ZEXT1632(auVar79);
          auVar7 = vfmadd213ps_fma(auVar52,auVar99,auVar97);
          auVar80 = vfnmadd213ps_fma(auVar49,auVar87,auVar85);
          auVar8 = vfmadd213ps_fma(auVar90,auVar99,auVar92);
          auVar85 = ZEXT1632(auVar77);
          auVar148 = vfnmadd231ps_fma(auVar91,auVar85,auVar89);
          auVar143 = vfnmadd213ps_fma(auVar51,auVar99,auVar96);
          auVar147 = vfnmadd213ps_fma(auVar52,auVar99,auVar97);
          auVar81 = vfnmadd231ps_fma(auVar92,ZEXT1632(auVar79),auVar90);
          auVar92 = vsubps_avx512vl(auVar100,ZEXT1632(auVar78));
          auVar90 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar80));
          auVar87 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar148));
          auVar53._4_4_ = auVar90._4_4_ * auVar148._4_4_;
          auVar53._0_4_ = auVar90._0_4_ * auVar148._0_4_;
          auVar53._8_4_ = auVar90._8_4_ * auVar148._8_4_;
          auVar53._12_4_ = auVar90._12_4_ * auVar148._12_4_;
          auVar53._16_4_ = auVar90._16_4_ * 0.0;
          auVar53._20_4_ = auVar90._20_4_ * 0.0;
          auVar53._24_4_ = auVar90._24_4_ * 0.0;
          auVar53._28_4_ = auVar89._28_4_;
          auVar77 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar80),auVar87);
          auVar54._4_4_ = auVar87._4_4_ * auVar78._4_4_;
          auVar54._0_4_ = auVar87._0_4_ * auVar78._0_4_;
          auVar54._8_4_ = auVar87._8_4_ * auVar78._8_4_;
          auVar54._12_4_ = auVar87._12_4_ * auVar78._12_4_;
          auVar54._16_4_ = auVar87._16_4_ * 0.0;
          auVar54._20_4_ = auVar87._20_4_ * 0.0;
          auVar54._24_4_ = auVar87._24_4_ * 0.0;
          auVar54._28_4_ = auVar87._28_4_;
          auVar9 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar148),auVar92);
          auVar55._4_4_ = auVar80._4_4_ * auVar92._4_4_;
          auVar55._0_4_ = auVar80._0_4_ * auVar92._0_4_;
          auVar55._8_4_ = auVar80._8_4_ * auVar92._8_4_;
          auVar55._12_4_ = auVar80._12_4_ * auVar92._12_4_;
          auVar55._16_4_ = auVar92._16_4_ * 0.0;
          auVar55._20_4_ = auVar92._20_4_ * 0.0;
          auVar55._24_4_ = auVar92._24_4_ * 0.0;
          auVar55._28_4_ = auVar92._28_4_;
          auVar10 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar78),auVar90);
          auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar98,ZEXT1632(auVar9));
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar98,ZEXT1632(auVar77));
          uVar73 = vcmpps_avx512vl(auVar90,auVar98,2);
          bVar66 = (byte)uVar73;
          fVar124 = (float)((uint)(bVar66 & 1) * auVar76._0_4_ |
                           (uint)!(bool)(bVar66 & 1) * auVar143._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          fVar126 = (float)((uint)bVar13 * auVar76._4_4_ | (uint)!bVar13 * auVar143._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          fVar128 = (float)((uint)bVar13 * auVar76._8_4_ | (uint)!bVar13 * auVar143._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          fVar130 = (float)((uint)bVar13 * auVar76._12_4_ | (uint)!bVar13 * auVar143._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar128,CONCAT44(fVar126,fVar124))));
          fVar125 = (float)((uint)(bVar66 & 1) * auVar75._0_4_ |
                           (uint)!(bool)(bVar66 & 1) * auVar147._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          fVar127 = (float)((uint)bVar13 * auVar75._4_4_ | (uint)!bVar13 * auVar147._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          fVar129 = (float)((uint)bVar13 * auVar75._8_4_ | (uint)!bVar13 * auVar147._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          fVar131 = (float)((uint)bVar13 * auVar75._12_4_ | (uint)!bVar13 * auVar147._12_4_);
          auVar93 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar125))));
          auVar118._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar88._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar81._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar13 * auVar88._4_4_ | (uint)!bVar13 * auVar81._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar13 * auVar88._8_4_ | (uint)!bVar13 * auVar81._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar13 * auVar88._12_4_ | (uint)!bVar13 * auVar81._12_4_);
          fVar132 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar88._16_4_);
          auVar118._16_4_ = fVar132;
          fVar139 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar88._20_4_);
          auVar118._20_4_ = fVar139;
          fVar146 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar88._24_4_);
          auVar118._24_4_ = fVar146;
          iVar2 = (uint)(byte)(uVar73 >> 7) * auVar88._28_4_;
          auVar118._28_4_ = iVar2;
          auVar90 = vblendmps_avx512vl(ZEXT1632(auVar78),auVar100);
          auVar119._0_4_ =
               (uint)(bVar66 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar77._0_4_;
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar13 * auVar90._4_4_ | (uint)!bVar13 * auVar77._4_4_;
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar13 * auVar90._8_4_ | (uint)!bVar13 * auVar77._8_4_;
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar13 * auVar90._12_4_ | (uint)!bVar13 * auVar77._12_4_;
          auVar119._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar90._16_4_;
          auVar119._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar90._20_4_;
          auVar119._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar90._24_4_;
          auVar119._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar90._28_4_;
          auVar90 = vblendmps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar7));
          auVar120._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar90._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar76._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar13 * auVar90._4_4_ | (uint)!bVar13 * auVar76._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar13 * auVar90._8_4_ | (uint)!bVar13 * auVar76._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar13 * auVar90._12_4_ | (uint)!bVar13 * auVar76._12_4_);
          fVar140 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar90._16_4_);
          auVar120._16_4_ = fVar140;
          fVar160 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar90._20_4_);
          auVar120._20_4_ = fVar160;
          fVar159 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar90._24_4_);
          auVar120._24_4_ = fVar159;
          auVar120._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar90._28_4_;
          auVar90 = vblendmps_avx512vl(ZEXT1632(auVar148),ZEXT1632(auVar8));
          auVar121._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar90._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar75._0_4_);
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar13 * auVar90._4_4_ | (uint)!bVar13 * auVar75._4_4_);
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar13 * auVar90._8_4_ | (uint)!bVar13 * auVar75._8_4_);
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar13 * auVar90._12_4_ | (uint)!bVar13 * auVar75._12_4_);
          fVar161 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar90._16_4_);
          auVar121._16_4_ = fVar161;
          fVar74 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar90._20_4_);
          auVar121._20_4_ = fVar74;
          fVar145 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar90._24_4_);
          auVar121._24_4_ = fVar145;
          iVar3 = (uint)(byte)(uVar73 >> 7) * auVar90._28_4_;
          auVar121._28_4_ = iVar3;
          auVar122._0_4_ =
               (uint)(bVar66 & 1) * (int)auVar78._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar100._0_4_;
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar13 * (int)auVar78._4_4_ | (uint)!bVar13 * auVar100._4_4_;
          bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar13 * (int)auVar78._8_4_ | (uint)!bVar13 * auVar100._8_4_;
          bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar13 * (int)auVar78._12_4_ | (uint)!bVar13 * auVar100._12_4_;
          auVar122._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar100._16_4_;
          auVar122._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar100._20_4_;
          auVar122._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar100._24_4_;
          auVar122._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar100._28_4_;
          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar73 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar73 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar100 = vsubps_avx512vl(auVar122,auVar99);
          auVar87 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar80._12_4_ |
                                                  (uint)!bVar17 * auVar7._12_4_,
                                                  CONCAT48((uint)bVar16 * (int)auVar80._8_4_ |
                                                           (uint)!bVar16 * auVar7._8_4_,
                                                           CONCAT44((uint)bVar13 *
                                                                    (int)auVar80._4_4_ |
                                                                    (uint)!bVar13 * auVar7._4_4_,
                                                                    (uint)(bVar66 & 1) *
                                                                    (int)auVar80._0_4_ |
                                                                    (uint)!(bool)(bVar66 & 1) *
                                                                    auVar7._0_4_)))),auVar93);
          auVar88 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar148._12_4_ |
                                                  (uint)!bVar18 * auVar8._12_4_,
                                                  CONCAT48((uint)bVar15 * (int)auVar148._8_4_ |
                                                           (uint)!bVar15 * auVar8._8_4_,
                                                           CONCAT44((uint)bVar14 *
                                                                    (int)auVar148._4_4_ |
                                                                    (uint)!bVar14 * auVar8._4_4_,
                                                                    (uint)(bVar66 & 1) *
                                                                    (int)auVar148._0_4_ |
                                                                    (uint)!(bool)(bVar66 & 1) *
                                                                    auVar8._0_4_)))),auVar118);
          auVar89 = vsubps_avx(auVar99,auVar119);
          auVar92 = vsubps_avx(auVar93,auVar120);
          auVar91 = vsubps_avx(auVar118,auVar121);
          auVar56._4_4_ = auVar88._4_4_ * fVar126;
          auVar56._0_4_ = auVar88._0_4_ * fVar124;
          auVar56._8_4_ = auVar88._8_4_ * fVar128;
          auVar56._12_4_ = auVar88._12_4_ * fVar130;
          auVar56._16_4_ = auVar88._16_4_ * 0.0;
          auVar56._20_4_ = auVar88._20_4_ * 0.0;
          auVar56._24_4_ = auVar88._24_4_ * 0.0;
          auVar56._28_4_ = 0;
          auVar77 = vfmsub231ps_fma(auVar56,auVar118,auVar100);
          auVar152._0_4_ = fVar125 * auVar100._0_4_;
          auVar152._4_4_ = fVar127 * auVar100._4_4_;
          auVar152._8_4_ = fVar129 * auVar100._8_4_;
          auVar152._12_4_ = fVar131 * auVar100._12_4_;
          auVar152._16_4_ = auVar100._16_4_ * 0.0;
          auVar152._20_4_ = auVar100._20_4_ * 0.0;
          auVar152._24_4_ = auVar100._24_4_ * 0.0;
          auVar152._28_4_ = 0;
          auVar76 = vfmsub231ps_fma(auVar152,auVar99,auVar87);
          auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar98,ZEXT1632(auVar77));
          auVar155._0_4_ = auVar87._0_4_ * auVar118._0_4_;
          auVar155._4_4_ = auVar87._4_4_ * auVar118._4_4_;
          auVar155._8_4_ = auVar87._8_4_ * auVar118._8_4_;
          auVar155._12_4_ = auVar87._12_4_ * auVar118._12_4_;
          auVar155._16_4_ = auVar87._16_4_ * fVar132;
          auVar155._20_4_ = auVar87._20_4_ * fVar139;
          auVar155._24_4_ = auVar87._24_4_ * fVar146;
          auVar155._28_4_ = 0;
          auVar77 = vfmsub231ps_fma(auVar155,auVar93,auVar88);
          auVar94 = vfmadd231ps_avx512vl(auVar90,auVar98,ZEXT1632(auVar77));
          auVar90 = vmulps_avx512vl(auVar91,auVar119);
          auVar90 = vfmsub231ps_avx512vl(auVar90,auVar89,auVar121);
          auVar57._4_4_ = auVar92._4_4_ * auVar121._4_4_;
          auVar57._0_4_ = auVar92._0_4_ * auVar121._0_4_;
          auVar57._8_4_ = auVar92._8_4_ * auVar121._8_4_;
          auVar57._12_4_ = auVar92._12_4_ * auVar121._12_4_;
          auVar57._16_4_ = auVar92._16_4_ * fVar161;
          auVar57._20_4_ = auVar92._20_4_ * fVar74;
          auVar57._24_4_ = auVar92._24_4_ * fVar145;
          auVar57._28_4_ = iVar3;
          auVar77 = vfmsub231ps_fma(auVar57,auVar120,auVar91);
          auVar156._0_4_ = auVar120._0_4_ * auVar89._0_4_;
          auVar156._4_4_ = auVar120._4_4_ * auVar89._4_4_;
          auVar156._8_4_ = auVar120._8_4_ * auVar89._8_4_;
          auVar156._12_4_ = auVar120._12_4_ * auVar89._12_4_;
          auVar156._16_4_ = fVar140 * auVar89._16_4_;
          auVar156._20_4_ = fVar160 * auVar89._20_4_;
          auVar156._24_4_ = fVar159 * auVar89._24_4_;
          auVar156._28_4_ = 0;
          auVar76 = vfmsub231ps_fma(auVar156,auVar92,auVar119);
          auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar98,auVar90);
          auVar84 = vfmadd231ps_avx512vl(auVar90,auVar98,ZEXT1632(auVar77));
          auVar90 = vmaxps_avx(auVar94,auVar84);
          uVar141 = vcmpps_avx512vl(auVar90,auVar98,2);
          bVar72 = bVar72 & (byte)uVar141;
          auVar95 = local_560;
          auVar86 = local_540;
          if (bVar72 == 0) goto LAB_019b6450;
          auVar58._4_4_ = auVar91._4_4_ * auVar87._4_4_;
          auVar58._0_4_ = auVar91._0_4_ * auVar87._0_4_;
          auVar58._8_4_ = auVar91._8_4_ * auVar87._8_4_;
          auVar58._12_4_ = auVar91._12_4_ * auVar87._12_4_;
          auVar58._16_4_ = auVar91._16_4_ * auVar87._16_4_;
          auVar58._20_4_ = auVar91._20_4_ * auVar87._20_4_;
          auVar58._24_4_ = auVar91._24_4_ * auVar87._24_4_;
          auVar58._28_4_ = auVar90._28_4_;
          auVar75 = vfmsub231ps_fma(auVar58,auVar92,auVar88);
          auVar59._4_4_ = auVar88._4_4_ * auVar89._4_4_;
          auVar59._0_4_ = auVar88._0_4_ * auVar89._0_4_;
          auVar59._8_4_ = auVar88._8_4_ * auVar89._8_4_;
          auVar59._12_4_ = auVar88._12_4_ * auVar89._12_4_;
          auVar59._16_4_ = auVar88._16_4_ * auVar89._16_4_;
          auVar59._20_4_ = auVar88._20_4_ * auVar89._20_4_;
          auVar59._24_4_ = auVar88._24_4_ * auVar89._24_4_;
          auVar59._28_4_ = auVar88._28_4_;
          auVar76 = vfmsub231ps_fma(auVar59,auVar100,auVar91);
          auVar60._4_4_ = auVar92._4_4_ * auVar100._4_4_;
          auVar60._0_4_ = auVar92._0_4_ * auVar100._0_4_;
          auVar60._8_4_ = auVar92._8_4_ * auVar100._8_4_;
          auVar60._12_4_ = auVar92._12_4_ * auVar100._12_4_;
          auVar60._16_4_ = auVar92._16_4_ * auVar100._16_4_;
          auVar60._20_4_ = auVar92._20_4_ * auVar100._20_4_;
          auVar60._24_4_ = auVar92._24_4_ * auVar100._24_4_;
          auVar60._28_4_ = auVar92._28_4_;
          auVar7 = vfmsub231ps_fma(auVar60,auVar89,auVar87);
          auVar77 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar76),ZEXT1632(auVar7));
          auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar75),auVar98);
          auVar87 = vrcp14ps_avx512vl(auVar90);
          auVar89 = auVar185._0_32_;
          auVar88 = vfnmadd213ps_avx512vl(auVar87,auVar90,auVar89);
          auVar77 = vfmadd132ps_fma(auVar88,auVar87,auVar87);
          auVar61._4_4_ = auVar7._4_4_ * auVar118._4_4_;
          auVar61._0_4_ = auVar7._0_4_ * auVar118._0_4_;
          auVar61._8_4_ = auVar7._8_4_ * auVar118._8_4_;
          auVar61._12_4_ = auVar7._12_4_ * auVar118._12_4_;
          auVar61._16_4_ = fVar132 * 0.0;
          auVar61._20_4_ = fVar139 * 0.0;
          auVar61._24_4_ = fVar146 * 0.0;
          auVar61._28_4_ = iVar2;
          auVar76 = vfmadd231ps_fma(auVar61,auVar93,ZEXT1632(auVar76));
          auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar99,ZEXT1632(auVar75));
          fVar146 = auVar77._0_4_;
          fVar132 = auVar77._4_4_;
          fVar139 = auVar77._8_4_;
          fVar140 = auVar77._12_4_;
          local_240 = ZEXT1632(CONCAT412(auVar76._12_4_ * fVar140,
                                         CONCAT48(auVar76._8_4_ * fVar139,
                                                  CONCAT44(auVar76._4_4_ * fVar132,
                                                           auVar76._0_4_ * fVar146))));
          auVar64._4_4_ = uStack_35c;
          auVar64._0_4_ = local_360;
          auVar64._8_4_ = uStack_358;
          auVar64._12_4_ = uStack_354;
          auVar64._16_4_ = uStack_350;
          auVar64._20_4_ = uStack_34c;
          auVar64._24_4_ = uStack_348;
          auVar64._28_4_ = uStack_344;
          uVar141 = vcmpps_avx512vl(local_240,auVar64,0xd);
          uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar26._4_4_ = uVar133;
          auVar26._0_4_ = uVar133;
          auVar26._8_4_ = uVar133;
          auVar26._12_4_ = uVar133;
          auVar26._16_4_ = uVar133;
          auVar26._20_4_ = uVar133;
          auVar26._24_4_ = uVar133;
          auVar26._28_4_ = uVar133;
          uVar19 = vcmpps_avx512vl(local_240,auVar26,2);
          bVar72 = (byte)uVar141 & (byte)uVar19 & bVar72;
          if (bVar72 == 0) goto LAB_019b6450;
          uVar141 = vcmpps_avx512vl(auVar90,auVar98,4);
          bVar72 = bVar72 & (byte)uVar141;
          auVar172 = ZEXT1664(local_5c0);
          auVar177 = ZEXT3264(local_540);
          auVar176 = ZEXT3264(local_560);
          if (bVar72 != 0) {
            fVar160 = auVar94._0_4_ * fVar146;
            fVar159 = auVar94._4_4_ * fVar132;
            auVar62._4_4_ = fVar159;
            auVar62._0_4_ = fVar160;
            fVar161 = auVar94._8_4_ * fVar139;
            auVar62._8_4_ = fVar161;
            fVar74 = auVar94._12_4_ * fVar140;
            auVar62._12_4_ = fVar74;
            fVar145 = auVar94._16_4_ * 0.0;
            auVar62._16_4_ = fVar145;
            fVar124 = auVar94._20_4_ * 0.0;
            auVar62._20_4_ = fVar124;
            fVar125 = auVar94._24_4_ * 0.0;
            auVar62._24_4_ = fVar125;
            auVar62._28_4_ = auVar90._28_4_;
            auVar87 = vsubps_avx512vl(auVar89,auVar62);
            local_280._0_4_ =
                 (float)((uint)(bVar66 & 1) * (int)fVar160 |
                        (uint)!(bool)(bVar66 & 1) * auVar87._0_4_);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar13 * (int)fVar159 | (uint)!bVar13 * auVar87._4_4_);
            bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar13 * (int)fVar161 | (uint)!bVar13 * auVar87._8_4_);
            bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar13 * (int)fVar74 | (uint)!bVar13 * auVar87._12_4_);
            bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
            local_280._16_4_ = (float)((uint)bVar13 * (int)fVar145 | (uint)!bVar13 * auVar87._16_4_)
            ;
            bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
            local_280._20_4_ = (float)((uint)bVar13 * (int)fVar124 | (uint)!bVar13 * auVar87._20_4_)
            ;
            bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
            local_280._24_4_ = (float)((uint)bVar13 * (int)fVar125 | (uint)!bVar13 * auVar87._24_4_)
            ;
            bVar13 = SUB81(uVar73 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar13 * auVar90._28_4_ | (uint)!bVar13 * auVar87._28_4_);
            auVar90 = vsubps_avx(ZEXT1632(auVar79),auVar85);
            auVar77 = vfmadd213ps_fma(auVar90,local_280,auVar85);
            uVar133 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
            auVar27._4_4_ = uVar133;
            auVar27._0_4_ = uVar133;
            auVar27._8_4_ = uVar133;
            auVar27._12_4_ = uVar133;
            auVar27._16_4_ = uVar133;
            auVar27._20_4_ = uVar133;
            auVar27._24_4_ = uVar133;
            auVar27._28_4_ = uVar133;
            auVar90 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                                         CONCAT48(auVar77._8_4_ + auVar77._8_4_,
                                                                  CONCAT44(auVar77._4_4_ +
                                                                           auVar77._4_4_,
                                                                           auVar77._0_4_ +
                                                                           auVar77._0_4_)))),auVar27
                                     );
            uVar141 = vcmpps_avx512vl(local_240,auVar90,6);
            if (((byte)uVar141 & bVar72) != 0) {
              auVar142._0_4_ = auVar84._0_4_ * fVar146;
              auVar142._4_4_ = auVar84._4_4_ * fVar132;
              auVar142._8_4_ = auVar84._8_4_ * fVar139;
              auVar142._12_4_ = auVar84._12_4_ * fVar140;
              auVar142._16_4_ = auVar84._16_4_ * 0.0;
              auVar142._20_4_ = auVar84._20_4_ * 0.0;
              auVar142._24_4_ = auVar84._24_4_ * 0.0;
              auVar142._28_4_ = 0;
              auVar90 = vsubps_avx512vl(auVar89,auVar142);
              auVar123._0_4_ =
                   (uint)(bVar66 & 1) * (int)auVar142._0_4_ |
                   (uint)!(bool)(bVar66 & 1) * auVar90._0_4_;
              bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
              auVar123._4_4_ = (uint)bVar13 * (int)auVar142._4_4_ | (uint)!bVar13 * auVar90._4_4_;
              bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
              auVar123._8_4_ = (uint)bVar13 * (int)auVar142._8_4_ | (uint)!bVar13 * auVar90._8_4_;
              bVar13 = (bool)((byte)(uVar73 >> 3) & 1);
              auVar123._12_4_ = (uint)bVar13 * (int)auVar142._12_4_ | (uint)!bVar13 * auVar90._12_4_
              ;
              bVar13 = (bool)((byte)(uVar73 >> 4) & 1);
              auVar123._16_4_ = (uint)bVar13 * (int)auVar142._16_4_ | (uint)!bVar13 * auVar90._16_4_
              ;
              bVar13 = (bool)((byte)(uVar73 >> 5) & 1);
              auVar123._20_4_ = (uint)bVar13 * (int)auVar142._20_4_ | (uint)!bVar13 * auVar90._20_4_
              ;
              bVar13 = (bool)((byte)(uVar73 >> 6) & 1);
              auVar123._24_4_ = (uint)bVar13 * (int)auVar142._24_4_ | (uint)!bVar13 * auVar90._24_4_
              ;
              auVar123._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar90._28_4_;
              auVar28._8_4_ = 0x40000000;
              auVar28._0_8_ = 0x4000000040000000;
              auVar28._12_4_ = 0x40000000;
              auVar28._16_4_ = 0x40000000;
              auVar28._20_4_ = 0x40000000;
              auVar28._24_4_ = 0x40000000;
              auVar28._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar123,auVar89,auVar28);
              local_220 = (undefined4)lVar71;
              local_210 = local_5c0;
              local_200 = local_4f0._0_8_;
              uStack_1f8 = local_4f0._8_8_;
              local_1f0 = local_500._0_8_;
              uStack_1e8 = local_500._8_8_;
              pGVar11 = (context->scene->geometries).items[local_5c8].ptr;
              if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar66 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar66 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar77 = vcvtsi2ss_avx512f(auVar178._0_16_,local_220);
                fVar146 = auVar77._0_4_;
                local_1c0[0] = (fVar146 + local_280._0_4_ + 0.0) * (float)local_2a0._0_4_;
                local_1c0[1] = (fVar146 + local_280._4_4_ + 1.0) * (float)local_2a0._4_4_;
                local_1c0[2] = (fVar146 + local_280._8_4_ + 2.0) * fStack_298;
                local_1c0[3] = (fVar146 + local_280._12_4_ + 3.0) * fStack_294;
                fStack_1b0 = (fVar146 + local_280._16_4_ + 4.0) * fStack_290;
                fStack_1ac = (fVar146 + local_280._20_4_ + 5.0) * fStack_28c;
                fStack_1a8 = (fVar146 + local_280._24_4_ + 6.0) * fStack_288;
                fStack_1a4 = fVar146 + local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                uVar73 = 0;
                uVar68 = (ulong)((byte)uVar141 & bVar72);
                for (uVar21 = uVar68; local_5a0 = pGVar11, local_21c = iVar20, (uVar21 & 1) == 0;
                    uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                  uVar73 = uVar73 + 1;
                }
                while (auVar77 = auVar178._0_16_, uVar68 != 0) {
                  uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_300 = local_1c0[uVar73];
                  local_2f0 = *(undefined4 *)(local_1a0 + uVar73 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar73 * 4);
                  local_590.context = context->user;
                  fVar132 = 1.0 - local_300;
                  fVar146 = fVar132 * fVar132 * -3.0;
                  auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * fVar132)),
                                            ZEXT416((uint)(local_300 * fVar132)),ZEXT416(0xc0000000)
                                           );
                  auVar79 = vfmsub132ss_fma(ZEXT416((uint)(local_300 * fVar132)),
                                            ZEXT416((uint)(local_300 * local_300)),
                                            ZEXT416(0x40000000));
                  fVar132 = auVar77._0_4_ * 3.0;
                  fVar139 = auVar79._0_4_ * 3.0;
                  fVar140 = local_300 * local_300 * 3.0;
                  auVar158._0_4_ = fVar140 * (float)local_370._0_4_;
                  auVar158._4_4_ = fVar140 * (float)local_370._4_4_;
                  auVar158._8_4_ = fVar140 * fStack_368;
                  auVar158._12_4_ = fVar140 * fStack_364;
                  auVar136._4_4_ = fVar139;
                  auVar136._0_4_ = fVar139;
                  auVar136._8_4_ = fVar139;
                  auVar136._12_4_ = fVar139;
                  auVar77 = vfmadd132ps_fma(auVar136,auVar158,local_500);
                  auVar150._4_4_ = fVar132;
                  auVar150._0_4_ = fVar132;
                  auVar150._8_4_ = fVar132;
                  auVar150._12_4_ = fVar132;
                  auVar77 = vfmadd132ps_fma(auVar150,auVar77,local_4f0);
                  auVar137._4_4_ = fVar146;
                  auVar137._0_4_ = fVar146;
                  auVar137._8_4_ = fVar146;
                  auVar137._12_4_ = fVar146;
                  auVar77 = vfmadd213ps_fma(auVar137,auVar172._0_16_,auVar77);
                  local_330 = auVar77._0_4_;
                  local_320 = vshufps_avx(auVar77,auVar77,0x55);
                  local_310 = vshufps_avx(auVar77,auVar77,0xaa);
                  local_2e0 = local_380._0_8_;
                  uStack_2d8 = local_380._8_8_;
                  local_2d0 = local_510;
                  vpcmpeqd_avx2(ZEXT1632(local_510),ZEXT1632(local_510));
                  uStack_2bc = (local_590.context)->instID[0];
                  local_2c0 = uStack_2bc;
                  uStack_2b8 = uStack_2bc;
                  uStack_2b4 = uStack_2bc;
                  uStack_2b0 = (local_590.context)->instPrimID[0];
                  uStack_2ac = uStack_2b0;
                  uStack_2a8 = uStack_2b0;
                  uStack_2a4 = uStack_2b0;
                  local_5e0 = local_390;
                  local_590.valid = (int *)local_5e0;
                  local_590.geometryUserPtr = local_5a0->userPtr;
                  local_590.hit = (RTCHitN *)&local_330;
                  local_590.N = 4;
                  local_5b0._0_8_ = uVar68;
                  local_598 = uVar73;
                  local_590.ray = (RTCRayN *)ray;
                  uStack_32c = local_330;
                  uStack_328 = local_330;
                  uStack_324 = local_330;
                  fStack_2fc = local_300;
                  fStack_2f8 = local_300;
                  fStack_2f4 = local_300;
                  uStack_2ec = local_2f0;
                  uStack_2e8 = local_2f0;
                  uStack_2e4 = local_2f0;
                  if (local_5a0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*local_5a0->occlusionFilterN)(&local_590);
                    auVar172 = ZEXT1664(local_5c0);
                    uVar68 = local_5b0._0_8_;
                  }
                  uVar73 = vptestmd_avx512vl(local_5e0,local_5e0);
                  if ((uVar73 & 0xf) != 0) {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_5a0->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_590);
                      auVar172 = ZEXT1664(local_5c0);
                      uVar68 = local_5b0._0_8_;
                    }
                    auVar77 = auVar178._0_16_;
                    auVar79 = *(undefined1 (*) [16])(local_590.ray + 0x80);
                    uVar73 = vptestmd_avx512vl(local_5e0,local_5e0);
                    uVar73 = uVar73 & 0xf;
                    auVar76 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar13 = (bool)((byte)uVar73 & 1);
                    auVar83._0_4_ = (uint)bVar13 * auVar76._0_4_ | (uint)!bVar13 * auVar79._0_4_;
                    bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
                    auVar83._4_4_ = (uint)bVar13 * auVar76._4_4_ | (uint)!bVar13 * auVar79._4_4_;
                    bVar13 = (bool)((byte)(uVar73 >> 2) & 1);
                    auVar83._8_4_ = (uint)bVar13 * auVar76._8_4_ | (uint)!bVar13 * auVar79._8_4_;
                    bVar13 = SUB81(uVar73 >> 3,0);
                    auVar83._12_4_ = (uint)bVar13 * auVar76._12_4_ | (uint)!bVar13 * auVar79._12_4_;
                    *(undefined1 (*) [16])(local_590.ray + 0x80) = auVar83;
                    if ((byte)uVar73 != 0) {
                      bVar66 = 1;
                      goto LAB_019b6481;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar133;
                  uVar73 = 0;
                  uVar68 = uVar68 ^ 1L << (local_598 & 0x3f);
                  for (uVar21 = uVar68; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000
                      ) {
                    uVar73 = uVar73 + 1;
                  }
                }
                bVar66 = 0;
LAB_019b6481:
                auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar185 = ZEXT3264(auVar90);
                auVar77 = vxorps_avx512vl(auVar77,auVar77);
                auVar178 = ZEXT1664(auVar77);
                auVar179 = ZEXT3264(local_3e0);
                auVar180 = ZEXT3264(local_400);
                auVar181 = ZEXT3264(local_420);
                auVar177 = ZEXT3264(local_540);
                auVar176 = ZEXT3264(local_560);
                auVar182 = ZEXT3264(local_4e0);
                auVar183 = ZEXT3264(local_4a0);
                auVar184 = ZEXT3264(local_4c0);
              }
              bVar65 = (bool)(bVar65 | bVar66);
            }
          }
        }
      }
    }
    if (bVar65) break;
    uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar25._4_4_ = uVar133;
    auVar25._0_4_ = uVar133;
    auVar25._8_4_ = uVar133;
    auVar25._12_4_ = uVar133;
    auVar25._16_4_ = uVar133;
    auVar25._20_4_ = uVar133;
    auVar25._24_4_ = uVar133;
    auVar25._28_4_ = uVar133;
    uVar141 = vcmpps_avx512vl(local_80,auVar25,2);
    local_448 = (ulong)((uint)uVar69 & (uint)uVar141);
  }
  return local_448 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }